

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward_int8_x86
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ulong uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined4 uVar11;
  undefined1 uVar15;
  undefined1 uVar18;
  undefined1 uVar20;
  undefined1 uVar22;
  undefined4 uVar16;
  undefined1 uVar24;
  undefined1 uVar27;
  undefined1 uVar29;
  undefined1 uVar31;
  undefined4 uVar26;
  int iVar32;
  int *piVar33;
  void *pvVar34;
  void *pvVar35;
  void *pvVar36;
  Layer *pLVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined4 uVar43;
  undefined1 uVar44;
  undefined1 uVar46;
  undefined1 uVar48;
  undefined1 uVar50;
  undefined4 uVar51;
  undefined1 uVar52;
  undefined1 uVar54;
  undefined1 uVar56;
  undefined1 uVar58;
  undefined8 uVar59;
  undefined4 uVar60;
  undefined1 uVar61;
  undefined1 uVar63;
  undefined1 uVar65;
  undefined1 uVar67;
  undefined1 auVar68 [14];
  undefined1 auVar69 [12];
  unkbyte10 Var70;
  undefined1 auVar71 [14];
  undefined1 auVar72 [12];
  unkbyte10 Var73;
  undefined1 auVar74 [12];
  undefined1 auVar75 [12];
  undefined1 auVar76 [12];
  undefined1 uVar77;
  long lVar78;
  long lVar79;
  int iVar80;
  undefined4 *puVar81;
  int iVar82;
  ulong uVar83;
  uint uVar84;
  int iVar85;
  int iVar86;
  long lVar87;
  uint uVar88;
  int iVar89;
  float fVar120;
  undefined1 auVar114 [12];
  undefined1 auVar115 [12];
  Option *opt_00;
  int iVar90;
  ulong uVar91;
  uint uVar92;
  undefined1 (*pauVar93) [16];
  undefined1 (*pauVar94) [16];
  bool bVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  ushort uVar98;
  ushort uVar103;
  ushort uVar104;
  ushort uVar105;
  ushort uVar106;
  int iVar107;
  ushort uVar109;
  int iVar110;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  ushort uVar108;
  ushort uVar111;
  undefined1 auVar102 [16];
  float fVar113;
  float fVar118;
  v4sf one;
  undefined1 auVar116 [16];
  undefined1 auVar119 [12];
  int iVar121;
  float fVar122;
  int iVar135;
  int iVar137;
  int iVar139;
  float fVar140;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar136;
  float fVar138;
  float fVar141;
  undefined1 auVar134 [16];
  float fVar142;
  char cVar153;
  char cVar154;
  char cVar155;
  char cVar156;
  float fVar157;
  char cVar158;
  char cVar159;
  float fVar160;
  undefined1 auVar143 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar161;
  float fVar162;
  float fVar175;
  float fVar176;
  undefined1 auVar163 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar177;
  undefined1 auVar174 [16];
  int iVar178;
  short sVar183;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined4 uVar187;
  undefined4 uVar188;
  undefined4 uVar189;
  undefined4 uVar190;
  Option opt_q;
  float top_rescale;
  float scale_out;
  Mat m_1;
  Option opt_g;
  int local_31c;
  int local_300;
  Mat local_2f8;
  float *local_2b0;
  ulong local_2a8;
  float *local_2a0;
  ulong local_298;
  void *local_290;
  Mat local_288;
  ulong local_240;
  undefined1 local_238 [40];
  undefined1 auStack_210 [16];
  ulong uStack_200;
  size_t local_1f8;
  long local_1e8;
  int local_1dc;
  undefined8 local_1d8;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  ulong local_1c8;
  int local_1c0;
  Allocator *local_1b8;
  undefined1 local_1b0 [16];
  undefined4 local_1a0;
  ulong local_198;
  undefined1 local_188 [16];
  void *local_178;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  Allocator *local_168;
  int local_160;
  Allocator *local_158;
  undefined1 local_150 [16];
  undefined4 local_140;
  ulong local_138;
  Mat local_128;
  size_type local_e0;
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  int iStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 auVar191 [12];
  undefined8 uVar17;
  undefined7 uVar19;
  undefined6 uVar21;
  undefined5 uVar23;
  undefined4 uVar25;
  undefined3 uVar28;
  undefined2 uVar30;
  undefined4 uVar45;
  undefined3 uVar47;
  undefined2 uVar49;
  undefined4 uVar53;
  undefined3 uVar55;
  undefined2 uVar57;
  undefined4 uVar62;
  undefined3 uVar64;
  undefined2 uVar66;
  short sVar112;
  undefined1 auVar117 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar179 [12];
  undefined1 auVar180 [16];
  
  local_128.elempack = bottom_blob->elempack;
  local_128.c = bottom_blob->c;
  if (local_128.elempack == 0) {
    bVar95 = false;
  }
  else {
    bVar95 = ((int)bottom_blob->elemsize << 3) / local_128.elempack == 8;
  }
  iVar85 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar86 = (this->super_ConvolutionDepthWise).dilation_w;
  iVar90 = (this->super_ConvolutionDepthWise).kernel_h;
  iVar32 = (this->super_ConvolutionDepthWise).dilation_h;
  local_128.data = bottom_blob->data;
  piVar33 = bottom_blob->refcount;
  local_128.refcount._0_4_ = SUB84(piVar33,0);
  local_128.refcount._4_4_ = (undefined4)((ulong)piVar33 >> 0x20);
  local_128.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
  local_128.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_128.allocator = bottom_blob->allocator;
  local_128.dims = bottom_blob->dims;
  local_128.w = bottom_blob->w;
  local_128.h = bottom_blob->h;
  local_128.d = bottom_blob->d;
  local_128.cstep = bottom_blob->cstep;
  if (piVar33 != (int *)0x0) {
    LOCK();
    *piVar33 = *piVar33 + 1;
    UNLOCK();
  }
  if (!bVar95) {
    uVar91 = (long)(local_128.elempack * local_128.c) /
             (long)(this->super_ConvolutionDepthWise).group;
    local_288.cstep = 0;
    local_288.data = (undefined4 *)0x0;
    local_288.refcount._0_4_ = 0;
    local_288.refcount._4_4_ = 0;
    local_288.elemsize._0_4_ = 0;
    local_288.elemsize._4_4_ = 0;
    local_288.elempack = 0;
    local_288.allocator = (Allocator *)0x0;
    local_288.dims = 0;
    local_288.w = 0;
    local_288.h = 0;
    local_288.d = 0;
    local_288.c = 0;
    Mat::create(&local_288,local_128.elempack * local_128.c,4,(Allocator *)0x0);
    lVar78 = (long)(this->super_ConvolutionDepthWise).group;
    if (0 < lVar78) {
      pvVar34 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data;
      lVar87 = 0;
      puVar81 = (undefined4 *)local_288.data;
      do {
        if (0 < (int)uVar91) {
          uVar187 = *(undefined4 *)((long)pvVar34 + lVar87 * 4);
          uVar83 = uVar91 & 0xffffffff;
          do {
            *puVar81 = uVar187;
            puVar81 = puVar81 + 1;
            uVar88 = (int)uVar83 - 1;
            uVar83 = (ulong)uVar88;
          } while (uVar88 != 0);
        }
        lVar87 = lVar87 + 1;
      } while (lVar87 != lVar78);
    }
    local_2f8.data = *(void **)opt;
    local_2f8.elemsize = (size_t)opt->workspace_allocator;
    uVar43 = opt->openmp_blocktime;
    uVar44 = opt->use_winograd_convolution;
    uVar46 = opt->use_sgemm_convolution;
    uVar48 = opt->use_int8_inference;
    uVar50 = opt->use_vulkan_compute;
    uVar49 = CONCAT11(uVar50,uVar48);
    uVar47 = CONCAT21(uVar49,uVar46);
    uVar45 = CONCAT31(uVar47,uVar44);
    local_2f8.allocator = *(Allocator **)&opt->use_bf16_storage;
    uVar51 = opt->vulkan_device_index;
    uVar52 = opt->use_reserved_1;
    uVar54 = opt->use_image_storage;
    uVar56 = opt->use_tensor_storage;
    uVar58 = opt->use_reserved_2;
    uVar57 = CONCAT11(uVar58,uVar56);
    uVar55 = CONCAT21(uVar57,uVar54);
    uVar53 = CONCAT31(uVar55,uVar52);
    uVar8 = opt->flush_denormals;
    uVar10 = opt->use_local_pool_allocator;
    uVar12 = opt->use_shader_local_memory;
    uVar13 = opt->use_cooperative_matrix;
    uVar14 = opt->use_winograd23_convolution;
    uVar15 = opt->use_winograd43_convolution;
    uVar18 = opt->use_winograd63_convolution;
    uVar20 = opt->use_a53_a55_optimized_kernel;
    uVar22 = opt->use_fp16_uniform;
    uVar24 = opt->use_int8_uniform;
    uVar27 = opt->use_reserved_9;
    uVar29 = opt->use_reserved_10;
    uVar31 = opt->use_reserved_11;
    uVar30 = CONCAT11(uVar31,uVar29);
    uVar28 = CONCAT21(uVar30,uVar27);
    uVar25 = CONCAT31(uVar28,uVar24);
    uVar23 = CONCAT41(uVar25,uVar22);
    uVar21 = CONCAT51(uVar23,uVar20);
    uVar19 = CONCAT61(uVar21,uVar18);
    uVar17 = CONCAT71(uVar19,uVar15);
    auVar191._4_8_ = uVar17;
    auVar191[3] = uVar14;
    auVar191[2] = uVar13;
    auVar191[1] = uVar12;
    auVar191[0] = uVar10;
    local_2f8.d = auVar191._0_4_;
    local_2f8.c = (int)uVar17;
    local_2f8.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    local_2f8.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_2f8.elempack = uVar43;
    local_2f8._28_4_ = uVar45;
    local_2f8.dims = uVar51;
    local_2f8.w = uVar53;
    local_2f8.h = uVar8;
    local_2f8._60_4_ = uVar25;
    quantize_to_int8(bottom_blob,&local_128,&local_288,(Option *)&local_2f8);
    bVar95 = local_128.data == (void *)0x0;
    lVar78 = (long)local_128.c * local_128.cstep;
    piVar33 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
    if (piVar33 != (int *)0x0) {
      LOCK();
      *piVar33 = *piVar33 + -1;
      UNLOCK();
      if (*piVar33 == 0) {
        if (local_288.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_288.data != (undefined4 *)0x0) {
            free(local_288.data);
          }
        }
        else {
          (*(local_288.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_300 = -100;
    if (bVar95 || lVar78 == 0) goto LAB_0040cbf8;
  }
  local_288.cstep = 0;
  local_288.data = (void *)0x0;
  local_288.refcount._0_4_ = 0;
  local_288.refcount._4_4_ = 0;
  local_288.elemsize._0_4_ = 0;
  local_288.elemsize._4_4_ = 0;
  local_288.elempack = 0;
  local_288.allocator = (Allocator *)0x0;
  local_288.dims = 0;
  local_288.w = 0;
  local_288.h = 0;
  local_288.d = 0;
  local_288.c = 0;
  ConvolutionDepthWise::make_padding(&this->super_ConvolutionDepthWise,&local_128,&local_288,opt);
  local_300 = -100;
  local_2f8.refcount = (int *)CONCAT44(local_2f8.refcount._4_4_,local_2f8.refcount._0_4_);
  if ((local_288.data != (void *)0x0) &&
     (local_2f8.refcount = (int *)CONCAT44(local_2f8.refcount._4_4_,local_2f8.refcount._0_4_),
     (long)local_288.c * local_288.cstep != 0)) {
    iVar85 = (~((iVar85 + -1) * iVar86) + local_288.w) / (this->super_ConvolutionDepthWise).stride_w
    ;
    iVar86 = iVar85 + 1;
    uVar91 = (long)(~((iVar90 + -1) * iVar32) + local_288.h) /
             (long)(this->super_ConvolutionDepthWise).stride_h;
    local_2a8 = uVar91 & 0xffffffff;
    iVar90 = (int)uVar91 + 1;
    local_188._0_4_ = local_288.elempack;
    uVar84 = local_288.c * local_288.elempack;
    uVar88 = (this->super_ConvolutionDepthWise).group;
    if ((uVar84 == uVar88) &&
       (uVar92 = (this->super_ConvolutionDepthWise).num_output, uVar88 == uVar92)) {
      local_1dc = local_288.w;
      uVar88 = 8;
      if (opt->use_packing_layout == false) {
        uVar88 = 1;
      }
      if ((uVar92 & 7) != 0) {
        uVar88 = 1;
      }
      iVar32 = (this->super_ConvolutionDepthWise).int8_scale_term;
      uVar84 = uVar88 * 4;
      if (100 < iVar32) {
        uVar84 = uVar88;
      }
      local_240 = (ulong)(uint)local_288.c;
      Mat::create(top_blob,iVar86,iVar90,(int)uVar92 / (int)uVar88,(ulong)uVar84,uVar88,
                  opt->blob_allocator);
      local_2f8.refcount = (int *)CONCAT44(local_2f8.refcount._4_4_,local_2f8.refcount._0_4_);
      if ((top_blob->data != (void *)0x0) &&
         (local_2f8.refcount = (int *)CONCAT44(local_2f8.refcount._4_4_,local_2f8.refcount._0_4_),
         (long)top_blob->c * top_blob->cstep != 0)) {
        local_300 = 0;
        if (local_188._0_4_ == 1) {
LAB_0040b949:
          iVar90 = (this->super_ConvolutionDepthWise).kernel_w;
          uVar88 = (this->super_ConvolutionDepthWise).kernel_h;
          opt_00 = (Option *)(ulong)uVar88;
          uVar9 = (this->super_ConvolutionDepthWise).dilation_w;
          uVar11 = (this->super_ConvolutionDepthWise).dilation_h;
          uVar16 = (this->super_ConvolutionDepthWise).stride_w;
          uVar26 = (this->super_ConvolutionDepthWise).stride_h;
          uVar84 = (this->super_ConvolutionDepthWise).activation_type;
          auVar97._0_4_ = -(uint)(uVar9 == 1);
          auVar97._4_4_ = -(uint)(uVar11 == 1);
          auVar97._8_4_ = -(uint)(uVar16 == 1);
          auVar97._12_4_ = -(uint)(uVar26 == 1);
          iVar86 = movmskps(iVar86,auVar97);
          if ((1 < uVar84 || (uVar88 != 3 || iVar90 != 3)) || iVar86 != 0xf) {
            if ((((uVar26 == 2 && uVar16 == 2) && (uVar88 == 3 && iVar90 == 3)) && uVar84 < 2) &&
                (~(byte)iVar86 & 3) == 0) {
              if (iVar32 < 0x65) {
                local_2f8.data = (void *)0x0;
                local_2f8.refcount = (int *)0x0;
                local_2f8.elemsize = 0;
                if (0 < (this->super_ConvolutionDepthWise).group) {
                  lVar78 = 0;
                  local_2f8.refcount = (int *)(float *)0x0;
                  do {
                    local_238._0_4_ =
                         1.0 / (*(float *)((long)(this->super_ConvolutionDepthWise).
                                                 weight_data_int8_scales.data + lVar78 * 4) *
                               *(float *)((long)(this->super_ConvolutionDepthWise).
                                                bottom_blob_int8_scales.data + lVar78 * 4));
                    if (local_2f8.refcount == (int *)local_2f8.elemsize) {
                      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                                ((vector<float,std::allocator<float>> *)&local_2f8,
                                 (iterator)local_2f8.refcount,(float *)local_238);
                    }
                    else {
                      *local_2f8.refcount = local_238._0_4_;
                      local_2f8.refcount = (int *)((float *)local_2f8.refcount + 1);
                    }
                    lVar78 = lVar78 + 1;
                  } while (lVar78 < (this->super_ConvolutionDepthWise).group);
                }
                std::vector<float,_std::allocator<float>_>::vector
                          (&local_d8,(vector<float,_std::allocator<float>_> *)&local_2f8);
                convdw3x3s2_int8_dequant_sse
                          (&local_288,top_blob,&this->weight_data_tm,
                           &(this->super_ConvolutionDepthWise).bias_data,&local_d8,opt_00);
                goto joined_r0x0040c9f5;
              }
              local_2f8.data = (void *)0x0;
              local_2f8.refcount = (int *)0x0;
              local_2f8.elemsize = 0;
              if (0 < (this->super_ConvolutionDepthWise).group) {
                lVar78 = 0;
                local_2f8.refcount = (int *)(float *)0x0;
                do {
                  fVar113 = *(float *)((long)(this->super_ConvolutionDepthWise).
                                             weight_data_int8_scales.data + lVar78 * 4);
                  local_238._0_4_ = 0.0;
                  if (fVar113 != 0.0) {
                    local_238._0_4_ =
                         1.0 / (fVar113 *
                               *(float *)((long)(this->super_ConvolutionDepthWise).
                                                bottom_blob_int8_scales.data + lVar78 * 4));
                  }
                  local_1d8._0_4_ =
                       *(float *)((long)(this->super_ConvolutionDepthWise).top_blob_int8_scales.data
                                 + lVar78 * 4);
                  if (local_2f8.refcount == (int *)local_2f8.elemsize) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)&local_2f8,
                               (iterator)local_2f8.refcount,(float *)local_238);
                  }
                  else {
                    *local_2f8.refcount = local_238._0_4_;
                    local_2f8.refcount = (int *)((float *)local_2f8.refcount + 1);
                  }
                  if (local_2f8.refcount == (int *)local_2f8.elemsize) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)&local_2f8,
                               (iterator)local_2f8.refcount,(float *)&local_1d8);
                  }
                  else {
                    *local_2f8.refcount = (int)(float)local_1d8;
                    local_2f8.refcount = (int *)((float *)local_2f8.refcount + 1);
                  }
                  lVar78 = lVar78 + 1;
                } while (lVar78 < (this->super_ConvolutionDepthWise).group);
              }
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_c0,(vector<float,_std::allocator<float>_> *)&local_2f8);
              convdw3x3s2_int8_requant_sse
                        (&local_288,top_blob,&this->weight_data_tm,
                         &(this->super_ConvolutionDepthWise).bias_data,&local_c0,opt_00);
              goto joined_r0x0040c3d8;
            }
            uVar88 = uVar88 * iVar90;
            local_e0 = (size_type)(int)uVar88;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&local_2f8,local_e0,
                       (allocator_type *)local_238);
            pvVar34 = local_2f8.data;
            if (0 < (this->super_ConvolutionDepthWise).kernel_h) {
              iVar86 = (this->super_ConvolutionDepthWise).dilation_h;
              iVar90 = (this->super_ConvolutionDepthWise).dilation_w;
              iVar80 = (this->super_ConvolutionDepthWise).kernel_w;
              iVar82 = 0;
              iVar89 = 0;
              iVar107 = 0;
              do {
                if (0 < (this->super_ConvolutionDepthWise).kernel_w) {
                  lVar78 = 0;
                  do {
                    *(int *)((long)local_2f8.data + (iVar107 + lVar78) * 4) = iVar89;
                    iVar89 = iVar89 + (this->super_ConvolutionDepthWise).dilation_w;
                    lVar78 = lVar78 + 1;
                  } while ((int)lVar78 < (this->super_ConvolutionDepthWise).kernel_w);
                  iVar107 = iVar107 + (int)lVar78;
                }
                iVar89 = iVar89 + (local_1dc * iVar86 - iVar90 * iVar80);
                iVar82 = iVar82 + 1;
              } while (iVar82 < (this->super_ConvolutionDepthWise).kernel_h);
            }
            if (0 < (this->super_ConvolutionDepthWise).group) {
              local_1e8 = 0;
              lVar78 = 0;
              do {
                lVar87 = local_1e8;
                if (-1 < (int)(uint)local_2a8) {
                  local_290 = (void *)(local_288.cstep * lVar78 *
                                       CONCAT44(local_288.elemsize._4_4_,
                                                (undefined4)local_288.elemsize) +
                                      (long)local_288.data);
                  local_2b0 = (float *)(top_blob->elemsize * lVar78 * top_blob->cstep +
                                       (long)top_blob->data);
                  local_298 = (long)local_288.w *
                              CONCAT44(local_288.elemsize._4_4_,(undefined4)local_288.elemsize);
                  pvVar35 = (this->weight_data_tm).data;
                  local_240 = 0;
                  local_2a0 = local_2b0;
                  do {
                    if (-1 < iVar85) {
                      lVar79 = (long)(int)local_240;
                      iVar86 = 0;
                      do {
                        auVar114 = ZEXT812(0);
                        fVar113 = 0.0;
                        if (0 < (int)uVar88) {
                          uVar91 = 0;
                          iVar90 = 0;
                          do {
                            iVar90 = iVar90 + (int)*(char *)((long)pvVar35 + uVar91 + lVar87) *
                                              (int)*(char *)((long)local_290 +
                                                            (long)*(int *)((long)pvVar34 +
                                                                          uVar91 * 4) +
                                                            (this->super_ConvolutionDepthWise).
                                                            stride_h * lVar79 * local_298 +
                                                            (long)iVar86 *
                                                            (long)(this->super_ConvolutionDepthWise)
                                                                  .stride_w);
                            uVar91 = uVar91 + 1;
                          } while (uVar88 != uVar91);
                          fVar113 = (float)iVar90;
                        }
                        fVar118 = *(float *)((long)(this->super_ConvolutionDepthWise).
                                                   weight_data_int8_scales.data + lVar78 * 4);
                        if (fVar118 != 0.0) {
                          auVar114._4_8_ = 0;
                          auVar114._0_4_ =
                               1.0 / (fVar118 *
                                     *(float *)((long)(this->super_ConvolutionDepthWise).
                                                      bottom_blob_int8_scales.data + lVar78 * 4));
                        }
                        uVar91 = auVar114._4_8_;
                        fVar113 = auVar114._0_4_ * fVar113;
                        if ((this->super_ConvolutionDepthWise).bias_term != 0) {
                          fVar113 = fVar113 + *(float *)((long)(this->super_ConvolutionDepthWise).
                                                               bias_data.data + lVar78 * 4);
                        }
                        auVar115._4_8_ = uVar91;
                        auVar115._0_4_ = fVar113;
                        auVar116._12_4_ = 0;
                        auVar116._0_12_ = auVar115;
                        iVar90 = (this->super_ConvolutionDepthWise).activation_type;
                        if (iVar90 - 1U < 6) {
                          auVar119._8_4_ = 0;
                          auVar119._0_8_ = uVar91;
                          switch(iVar90) {
                          case 1:
                            if (fVar113 <= 0.0) {
                              auVar42._12_4_ = 0;
                              auVar42._0_12_ = auVar119;
                              auVar116 = auVar42 << 0x20;
                            }
                            goto LAB_0040c71d;
                          case 2:
                            fVar118 = (float)(~-(uint)(0.0 < fVar113) &
                                              *(this->super_ConvolutionDepthWise).activation_params.
                                               data | -(uint)(0.0 < fVar113) & 0x3f800000) * fVar113
                            ;
                            break;
                          case 3:
                            pfVar1 = (float *)(this->super_ConvolutionDepthWise).activation_params.
                                              data;
                            fVar118 = *pfVar1;
                            if (fVar113 <= fVar118) {
                              auVar116._4_8_ = uVar91;
                              auVar116._0_4_ = fVar118;
                              auVar116._12_4_ = 0;
                            }
                            fVar118 = pfVar1[1];
                            if (auVar116._0_4_ <= fVar118) {
                              fVar118 = auVar116._0_4_;
                            }
                            break;
                          case 4:
                            if (88.37626 <= fVar113) {
                              auVar117._4_12_ = auVar119;
                              auVar117._0_4_ = 0x42b0c0a5;
                              auVar115 = auVar117._0_12_;
                            }
                            uVar84 = -(uint)(auVar115._0_4_ < -88.37626);
                            fVar113 = expf((float)(uVar84 & 0x42b0c0a5 |
                                                  ~uVar84 & (uint)-auVar115._0_4_));
                            fVar118 = 1.0 / (fVar113 + 1.0);
                            break;
                          case 5:
                            local_188 = auVar116;
                            fVar113 = expf(fVar113);
                            fVar113 = logf(fVar113 + 1.0);
                            fVar113 = tanhf(fVar113);
                            fVar118 = fVar113 * (float)local_188._0_4_;
                            break;
                          case 6:
                            pfVar1 = (float *)(this->super_ConvolutionDepthWise).activation_params.
                                              data;
                            fVar120 = *pfVar1;
                            fVar122 = pfVar1[1];
                            fVar136 = -fVar122 / fVar120;
                            fVar118 = 0.0;
                            if (fVar136 <= fVar113) {
                              if (fVar136 + 1.0 / fVar120 < fVar113) goto LAB_0040c71d;
                              fVar118 = (fVar120 * fVar113 + fVar122) * fVar113;
                            }
                          }
                        }
                        else {
LAB_0040c71d:
                          fVar118 = auVar116._0_4_;
                        }
                        if (iVar32 < 0x65) {
                          *local_2a0 = fVar118;
                          local_2a0 = local_2a0 + 1;
                        }
                        else {
                          fVar113 = roundf(fVar118 * *(float *)((long)(this->
                                                  super_ConvolutionDepthWise).top_blob_int8_scales.
                                                  data + lVar78 * 4));
                          iVar90 = (int)fVar113;
                          if (iVar90 < -0x7e) {
                            iVar90 = -0x7f;
                          }
                          uVar77 = (undefined1)iVar90;
                          if (0x7e < iVar90) {
                            uVar77 = 0x7f;
                          }
                          *(undefined1 *)local_2b0 = uVar77;
                          local_2b0 = (float *)((long)local_2b0 + 1);
                        }
                        bVar95 = iVar86 != iVar85;
                        iVar86 = iVar86 + 1;
                      } while (bVar95);
                    }
                    iVar86 = (int)local_240;
                    local_240 = (ulong)(iVar86 + 1);
                  } while (iVar86 != (uint)local_2a8);
                }
                lVar78 = lVar78 + 1;
                local_1e8 = local_1e8 + local_e0;
              } while (lVar78 < (this->super_ConvolutionDepthWise).group);
            }
            if (local_2f8.data != (void *)0x0) {
              operator_delete(local_2f8.data,local_2f8.elemsize - (long)local_2f8.data);
            }
            local_300 = 0;
            local_2f8.refcount = (int *)CONCAT44(local_2f8.refcount._4_4_,local_2f8.refcount._0_4_);
          }
          else {
            if (iVar32 < 0x65) {
              local_2f8.data = (void *)0x0;
              local_2f8.refcount = (int *)0x0;
              local_2f8.elemsize = 0;
              if (0 < (this->super_ConvolutionDepthWise).group) {
                lVar78 = 0;
                local_2f8.refcount = (int *)(float *)0x0;
                do {
                  local_238._0_4_ =
                       1.0 / (*(float *)((long)(this->super_ConvolutionDepthWise).
                                               weight_data_int8_scales.data + lVar78 * 4) *
                             *(float *)((long)(this->super_ConvolutionDepthWise).
                                              bottom_blob_int8_scales.data + lVar78 * 4));
                  if (local_2f8.refcount == (int *)local_2f8.elemsize) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)&local_2f8,
                               (iterator)local_2f8.refcount,(float *)local_238);
                  }
                  else {
                    *local_2f8.refcount = local_238._0_4_;
                    local_2f8.refcount = (int *)((float *)local_2f8.refcount + 1);
                  }
                  lVar78 = lVar78 + 1;
                } while (lVar78 < (this->super_ConvolutionDepthWise).group);
              }
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_a8,(vector<float,_std::allocator<float>_> *)&local_2f8);
              convdw3x3s1_int8_dequant_sse
                        (&local_288,top_blob,&this->weight_data_tm,
                         &(this->super_ConvolutionDepthWise).bias_data,&local_a8,opt_00);
              local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
joined_r0x0040c9f5:
              if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_d8.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_d8.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              local_2f8.data = (void *)0x0;
              local_2f8.refcount = (int *)0x0;
              local_2f8.elemsize = 0;
              if (0 < (this->super_ConvolutionDepthWise).group) {
                lVar78 = 0;
                local_2f8.refcount = (int *)(float *)0x0;
                do {
                  fVar113 = *(float *)((long)(this->super_ConvolutionDepthWise).
                                             weight_data_int8_scales.data + lVar78 * 4);
                  local_238._0_4_ = 0.0;
                  if (fVar113 != 0.0) {
                    local_238._0_4_ =
                         1.0 / (fVar113 *
                               *(float *)((long)(this->super_ConvolutionDepthWise).
                                                bottom_blob_int8_scales.data + lVar78 * 4));
                  }
                  local_1d8._0_4_ =
                       *(float *)((long)(this->super_ConvolutionDepthWise).top_blob_int8_scales.data
                                 + lVar78 * 4);
                  if (local_2f8.refcount == (int *)local_2f8.elemsize) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)&local_2f8,
                               (iterator)local_2f8.refcount,(float *)local_238);
                  }
                  else {
                    *local_2f8.refcount = local_238._0_4_;
                    local_2f8.refcount = (int *)((float *)local_2f8.refcount + 1);
                  }
                  if (local_2f8.refcount == (int *)local_2f8.elemsize) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)&local_2f8,
                               (iterator)local_2f8.refcount,(float *)&local_1d8);
                  }
                  else {
                    *local_2f8.refcount = (int)(float)local_1d8;
                    local_2f8.refcount = (int *)((float *)local_2f8.refcount + 1);
                  }
                  lVar78 = lVar78 + 1;
                } while (lVar78 < (this->super_ConvolutionDepthWise).group);
              }
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_90,(vector<float,_std::allocator<float>_> *)&local_2f8);
              convdw3x3s1_int8_requant_sse
                        (&local_288,top_blob,&this->weight_data_tm,
                         &(this->super_ConvolutionDepthWise).bias_data,&local_90,opt_00);
              local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
joined_r0x0040c3d8:
              if (local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_c0.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_c0.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
            }
            if (local_2f8.data != (void *)0x0) {
              operator_delete(local_2f8.data,local_2f8.elemsize - (long)local_2f8.data);
            }
            local_300 = 0;
            pLVar37 = this->activation;
            if (pLVar37 != (Layer *)0x0) {
              (*pLVar37->_vptr_Layer[9])(pLVar37,top_blob,opt);
            }
          }
        }
        else {
          local_2f8.refcount = (int *)CONCAT44(local_2f8.refcount._4_4_,local_2f8.refcount._0_4_);
          if (local_188._0_4_ == 8) {
            uVar83 = (long)(this->super_ConvolutionDepthWise).kernel_h *
                     (long)(this->super_ConvolutionDepthWise).kernel_w;
            uVar91 = uVar83;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&local_2f8,uVar83,
                       (allocator_type *)local_238);
            if (0 < (this->super_ConvolutionDepthWise).kernel_h) {
              iVar86 = (this->super_ConvolutionDepthWise).dilation_h;
              iVar90 = (this->super_ConvolutionDepthWise).dilation_w;
              iVar80 = (this->super_ConvolutionDepthWise).kernel_w;
              iVar82 = 0;
              uVar91 = 0;
              iVar89 = 0;
              do {
                uVar88 = (uint)uVar91;
                if (0 < (this->super_ConvolutionDepthWise).kernel_w) {
                  lVar78 = 0;
                  do {
                    *(int *)((long)local_2f8.data + (iVar82 + lVar78) * 4) = (int)uVar91;
                    uVar88 = (int)uVar91 + (this->super_ConvolutionDepthWise).dilation_w;
                    uVar91 = (ulong)uVar88;
                    lVar78 = lVar78 + 1;
                  } while ((int)lVar78 < (this->super_ConvolutionDepthWise).kernel_w);
                  iVar82 = iVar82 + (int)lVar78;
                }
                uVar91 = (ulong)(uVar88 + (iVar86 * local_1dc - iVar90 * iVar80));
                iVar89 = iVar89 + 1;
              } while (iVar89 < (this->super_ConvolutionDepthWise).kernel_h);
            }
            auVar97 = _DAT_005f09a0;
            if (0 < (int)local_240) {
              iVar86 = (int)uVar83 * 8;
              local_1e8 = CONCAT44(local_1e8._4_4_,iVar86);
              local_290 = (void *)0x0;
              auVar96._0_12_ = ZEXT812(0);
              auVar96._12_4_ = 0;
              uVar187 = 0x42b0c0a5;
              uVar188 = 0x42b0c0a5;
              uVar189 = 0x42b0c0a5;
              uVar190 = 0x42b0c0a5;
              fVar113 = (float)DAT_005f09a0;
              fVar118 = DAT_005f09a0._4_4_;
              fVar120 = DAT_005f09a0._8_4_;
              local_298 = 0;
              do {
                if (-1 < (int)(uint)local_2a8) {
                  local_2a0 = (float *)(local_288.cstep * local_298 *
                                        CONCAT44(local_288.elemsize._4_4_,
                                                 (undefined4)local_288.elemsize) +
                                       (long)local_288.data);
                  pauVar93 = (undefined1 (*) [16])
                             (top_blob->elemsize * local_298 * top_blob->cstep +
                             (long)top_blob->data);
                  local_2b0 = (float *)((long)local_288.w *
                                       CONCAT44(local_288.elemsize._4_4_,
                                                (undefined4)local_288.elemsize));
                  pvVar34 = (this->weight_data_tm).data;
                  pauVar94 = pauVar93;
                  iVar90 = 0;
                  do {
                    if (-1 < iVar85) {
                      iVar80 = 0;
                      do {
                        if ((int)uVar83 < 1) {
                          auVar171 = ZEXT816(0);
                          auVar127 = ZEXT816(0);
                        }
                        else {
                          iVar82 = 0;
                          iVar89 = 0;
                          iVar107 = 0;
                          iVar110 = 0;
                          uVar91 = 0;
                          iVar121 = 0;
                          iVar135 = 0;
                          iVar137 = 0;
                          iVar139 = 0;
                          do {
                            uVar7 = *(ulong *)((long)local_2a0 +
                                              (long)*(int *)((long)local_2f8.data + uVar91 * 4) * 8
                                              + (long)(this->super_ConvolutionDepthWise).stride_h *
                                                (long)iVar90 * (long)local_2b0 +
                                                (long)((this->super_ConvolutionDepthWise).stride_w *
                                                       iVar80 * 8));
                            cVar153 = (char)(uVar7 >> 8);
                            cVar154 = (char)(uVar7 >> 0x10);
                            cVar155 = (char)(uVar7 >> 0x18);
                            cVar156 = (char)(uVar7 >> 0x20);
                            cVar158 = (char)(uVar7 >> 0x28);
                            cVar159 = (char)(uVar7 >> 0x30);
                            auVar185._8_6_ = 0;
                            auVar185._0_8_ = uVar7;
                            auVar185[0xe] = (char)(uVar7 >> 0x38);
                            auVar185[0xf] = -((long)uVar7 < 0);
                            auVar173._14_2_ = auVar185._14_2_;
                            auVar173._8_5_ = 0;
                            auVar173._0_8_ = uVar7;
                            auVar173[0xd] = -(cVar159 < '\0');
                            auVar148._13_3_ = auVar173._13_3_;
                            auVar148._8_4_ = 0;
                            auVar148._0_8_ = uVar7;
                            auVar148[0xc] = cVar159;
                            auVar147._12_4_ = auVar148._12_4_;
                            auVar147._8_3_ = 0;
                            auVar147._0_8_ = uVar7;
                            auVar147[0xb] = -(cVar158 < '\0');
                            auVar146._11_5_ = auVar147._11_5_;
                            auVar146._8_2_ = 0;
                            auVar146._0_8_ = uVar7;
                            auVar146[10] = cVar158;
                            auVar145._10_6_ = auVar146._10_6_;
                            auVar145[8] = 0;
                            auVar145._0_8_ = uVar7;
                            auVar145[9] = -(cVar156 < '\0');
                            auVar144._9_7_ = auVar145._9_7_;
                            auVar144[8] = cVar156;
                            auVar144._0_8_ = uVar7;
                            Var70 = CONCAT91(CONCAT81(auVar144._8_8_,-(cVar155 < '\0')),cVar155);
                            auVar69._2_10_ = Var70;
                            auVar69[1] = -(cVar154 < '\0');
                            auVar69[0] = cVar154;
                            auVar68._2_12_ = auVar69;
                            auVar68[1] = -(cVar153 < '\0');
                            auVar68[0] = cVar153;
                            auVar143._0_2_ = CONCAT11(-((char)uVar7 < '\0'),(char)uVar7);
                            auVar143._2_14_ = auVar68;
                            uVar7 = *(ulong *)((long)pvVar34 + uVar91 * 8 + (long)(int)local_290);
                            cVar153 = (char)(uVar7 >> 8);
                            cVar154 = (char)(uVar7 >> 0x10);
                            cVar155 = (char)(uVar7 >> 0x18);
                            cVar156 = (char)(uVar7 >> 0x20);
                            cVar158 = (char)(uVar7 >> 0x28);
                            cVar159 = (char)(uVar7 >> 0x30);
                            auVar170._8_6_ = 0;
                            auVar170._0_8_ = uVar7;
                            auVar170[0xe] = (char)(uVar7 >> 0x38);
                            auVar170[0xf] = -((long)uVar7 < 0);
                            auVar169._14_2_ = auVar170._14_2_;
                            auVar169._8_5_ = 0;
                            auVar169._0_8_ = uVar7;
                            auVar169[0xd] = -(cVar159 < '\0');
                            auVar168._13_3_ = auVar169._13_3_;
                            auVar168._8_4_ = 0;
                            auVar168._0_8_ = uVar7;
                            auVar168[0xc] = cVar159;
                            auVar167._12_4_ = auVar168._12_4_;
                            auVar167._8_3_ = 0;
                            auVar167._0_8_ = uVar7;
                            auVar167[0xb] = -(cVar158 < '\0');
                            auVar166._11_5_ = auVar167._11_5_;
                            auVar166._8_2_ = 0;
                            auVar166._0_8_ = uVar7;
                            auVar166[10] = cVar158;
                            auVar165._10_6_ = auVar166._10_6_;
                            auVar165[8] = 0;
                            auVar165._0_8_ = uVar7;
                            auVar165[9] = -(cVar156 < '\0');
                            auVar164._9_7_ = auVar165._9_7_;
                            auVar164[8] = cVar156;
                            auVar164._0_8_ = uVar7;
                            Var73 = CONCAT91(CONCAT81(auVar164._8_8_,-(cVar155 < '\0')),cVar155);
                            auVar72._2_10_ = Var73;
                            auVar72[1] = -(cVar154 < '\0');
                            auVar72[0] = cVar154;
                            auVar71._2_12_ = auVar72;
                            auVar71[1] = -(cVar153 < '\0');
                            auVar71[0] = cVar153;
                            auVar163._0_2_ = CONCAT11(-((char)uVar7 < '\0'),(char)uVar7);
                            auVar163._2_14_ = auVar71;
                            sVar183 = (short)Var73 * (short)Var70;
                            auVar171 = pmulhw(auVar163,auVar143);
                            iVar178 = CONCAT22(auVar171._6_2_,sVar183);
                            Var70 = CONCAT64(CONCAT42(iVar178,auVar171._4_2_),
                                             CONCAT22(auVar72._0_2_ * auVar69._0_2_,sVar183));
                            auVar74._4_8_ = (long)((unkuint10)Var70 >> 0x10);
                            auVar74._2_2_ = auVar171._2_2_;
                            auVar74._0_2_ = auVar71._0_2_ * auVar68._0_2_;
                            iVar82 = iVar82 + CONCAT22(auVar171._0_2_,
                                                       auVar163._0_2_ * auVar143._0_2_);
                            iVar89 = iVar89 + auVar74._0_4_;
                            iVar107 = iVar107 + (int)((unkuint10)Var70 >> 0x10);
                            iVar110 = iVar110 + iVar178;
                            iVar178 = CONCAT22(auVar171._8_2_,auVar164._8_2_ * auVar144._8_2_);
                            auVar179._0_8_ =
                                 CONCAT26(auVar171._10_2_,
                                          CONCAT24(auVar166._10_2_ * auVar146._10_2_,iVar178));
                            auVar179._8_2_ = auVar168._12_2_ * auVar148._12_2_;
                            auVar179._10_2_ = auVar171._12_2_;
                            auVar180._12_2_ = auVar169._14_2_ * auVar173._14_2_;
                            auVar180._0_12_ = auVar179;
                            auVar180._14_2_ = auVar171._14_2_;
                            iVar121 = iVar121 + iVar178;
                            iVar135 = iVar135 + (int)((ulong)auVar179._0_8_ >> 0x20);
                            iVar137 = iVar137 + auVar179._8_4_;
                            iVar139 = iVar139 + auVar180._12_4_;
                            uVar91 = uVar91 + 1;
                          } while ((uVar83 & 0xffffffff) != uVar91);
                          auVar127._0_4_ = (float)iVar82;
                          auVar127._4_4_ = (float)iVar89;
                          auVar127._8_4_ = (float)iVar107;
                          auVar127._12_4_ = (float)iVar110;
                          auVar171._0_4_ = (float)iVar121;
                          auVar171._4_4_ = (float)iVar135;
                          auVar171._8_4_ = (float)iVar137;
                          auVar171._12_4_ = (float)iVar139;
                        }
                        pvVar35 = (this->super_ConvolutionDepthWise).weight_data_int8_scales.data;
                        pvVar36 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data;
                        pfVar1 = (float *)((long)pvVar36 + local_298 * 0x20);
                        pfVar3 = (float *)((long)pvVar36 + local_298 * 0x20 + 0x10);
                        pfVar2 = (float *)((long)pvVar35 + local_298 * 0x20);
                        pfVar4 = (float *)((long)pvVar35 + local_298 * 0x20 + 0x10);
                        auVar172._0_4_ = *pfVar1 * *pfVar2;
                        auVar172._4_4_ = pfVar1[1] * pfVar2[1];
                        auVar172._8_4_ = pfVar1[2] * pfVar2[2];
                        auVar172._12_4_ = pfVar1[3] * pfVar2[3];
                        auVar173 = rcpps(auVar172,auVar172);
                        auVar184._0_4_ = *pfVar3 * *pfVar4;
                        auVar184._4_4_ = pfVar3[1] * pfVar4[1];
                        auVar184._8_4_ = pfVar3[2] * pfVar4[2];
                        auVar184._12_4_ = pfVar3[3] * pfVar4[3];
                        auVar185 = rcpps(auVar184,auVar184);
                        auVar100._0_4_ =
                             (float)(-(uint)(*pfVar2 != 0.0) & auVar173._0_4_) * auVar127._0_4_;
                        auVar100._4_4_ =
                             (float)(-(uint)(pfVar2[1] != 0.0) & auVar173._4_4_) * auVar127._4_4_;
                        auVar100._8_4_ =
                             (float)(-(uint)(pfVar2[2] != 0.0) & auVar173._8_4_) * auVar127._8_4_;
                        auVar100._12_4_ =
                             (float)(-(uint)(pfVar2[3] != 0.0) & auVar173._12_4_) * auVar127._12_4_;
                        auVar182._0_4_ =
                             (float)(-(uint)(*pfVar4 != 0.0) & auVar185._0_4_) * auVar171._0_4_;
                        auVar182._4_4_ =
                             (float)(-(uint)(pfVar4[1] != 0.0) & auVar185._4_4_) * auVar171._4_4_;
                        auVar182._8_4_ =
                             (float)(-(uint)(pfVar4[2] != 0.0) & auVar185._8_4_) * auVar171._8_4_;
                        auVar182._12_4_ =
                             (float)(-(uint)(pfVar4[3] != 0.0) & auVar185._12_4_) * auVar171._12_4_;
                        if ((this->super_ConvolutionDepthWise).bias_term != 0) {
                          pvVar35 = (this->super_ConvolutionDepthWise).bias_data.data;
                          auVar171 = *(undefined1 (*) [16])((long)pvVar35 + local_298 * 0x20);
                          auVar127 = *(undefined1 (*) [16])((long)pvVar35 + local_298 * 0x20 + 0x10)
                          ;
                          auVar100._0_4_ = auVar100._0_4_ + auVar171._0_4_;
                          auVar100._4_4_ = auVar100._4_4_ + auVar171._4_4_;
                          auVar100._8_4_ = auVar100._8_4_ + auVar171._8_4_;
                          auVar100._12_4_ = auVar100._12_4_ + auVar171._12_4_;
                          auVar182._0_4_ = auVar182._0_4_ + auVar127._0_4_;
                          auVar182._4_4_ = auVar182._4_4_ + auVar127._4_4_;
                          auVar182._8_4_ = auVar182._8_4_ + auVar127._8_4_;
                          auVar182._12_4_ = auVar182._12_4_ + auVar127._12_4_;
                        }
                        iVar82 = (this->super_ConvolutionDepthWise).activation_type + -1;
                        fVar142 = auVar97._12_4_;
                        fVar122 = auVar100._0_4_;
                        fVar136 = auVar100._4_4_;
                        fVar138 = auVar100._8_4_;
                        fVar141 = auVar100._12_4_;
                        switch(iVar82) {
                        case 0:
                          auVar100 = maxps(auVar100,auVar96);
                          break;
                        case 1:
                          auVar127 = maxps(auVar100,auVar96);
                          auVar171 = minps(auVar100,auVar96);
                          fVar122 = *(this->super_ConvolutionDepthWise).activation_params.data;
                          auVar100._4_4_ = fVar122 * auVar171._4_4_ + auVar127._4_4_;
                          auVar100._0_4_ = fVar122 * auVar171._0_4_ + auVar127._0_4_;
                          auVar100._8_4_ = fVar122 * auVar171._8_4_ + auVar127._8_4_;
                          auVar100._12_4_ = fVar122 * auVar171._12_4_ + auVar127._12_4_;
                          break;
                        case 2:
                          puVar81 = (undefined4 *)
                                    (this->super_ConvolutionDepthWise).activation_params.data;
                          uVar5 = *puVar81;
                          uVar6 = puVar81[1];
                          auVar126._4_4_ = uVar5;
                          auVar126._0_4_ = uVar5;
                          auVar126._8_4_ = uVar5;
                          auVar126._12_4_ = uVar5;
                          auVar149._4_4_ = uVar6;
                          auVar149._0_4_ = uVar6;
                          auVar149._8_4_ = uVar6;
                          auVar149._12_4_ = uVar6;
                          auVar171 = maxps(auVar100,auVar126);
                          auVar100 = minps(auVar171,auVar149);
                          break;
                        case 3:
                          auVar99._0_8_ = auVar100._0_8_ ^ 0x8000000080000000;
                          auVar99._8_4_ = -fVar138;
                          auVar99._12_4_ = -fVar141;
                          auVar39._4_4_ = uVar188;
                          auVar39._0_4_ = uVar187;
                          auVar39._8_4_ = uVar189;
                          auVar39._12_4_ = uVar190;
                          auVar171 = minps(auVar99,auVar39);
                          auVar171 = maxps(auVar171,_DAT_005f0970);
                          fVar136 = auVar171._0_4_ * 1.442695 + 0.5;
                          fVar141 = auVar171._4_4_ * 1.442695 + 0.5;
                          fVar160 = auVar171._8_4_ * 1.442695 + 0.5;
                          fVar140 = auVar171._12_4_ * 1.442695 + 0.5;
                          fVar122 = (float)(int)fVar136;
                          fVar138 = (float)(int)fVar141;
                          fVar157 = (float)(int)fVar160;
                          fVar161 = (float)(int)fVar140;
                          fVar122 = fVar122 - (float)(-(uint)(fVar136 < fVar122) & (uint)fVar113);
                          fVar138 = fVar138 - (float)(-(uint)(fVar141 < fVar138) & (uint)fVar118);
                          fVar157 = fVar157 - (float)(-(uint)(fVar160 < fVar157) & (uint)fVar120);
                          fVar161 = fVar161 - (float)(-(uint)(fVar140 < fVar161) & (uint)fVar142);
                          fVar136 = fVar122 * -0.6931472 + auVar171._0_4_;
                          fVar141 = fVar138 * -0.6931472 + auVar171._4_4_;
                          fVar160 = fVar157 * -0.6931472 + auVar171._8_4_;
                          fVar140 = fVar161 * -0.6931472 + auVar171._12_4_;
                          auVar150._0_4_ =
                               (float)((int)fVar122 * 0x800000 + (int)fVar113) *
                               (fVar136 + fVar113 +
                               (((((fVar136 * 0.00019875691 + 0.0013981999) * fVar136 + 0.008333452)
                                  * fVar136 + 0.041665796) * fVar136 + 0.16666666) * fVar136 + 0.5)
                               * fVar136 * fVar136) + fVar113;
                          auVar150._4_4_ =
                               (float)((int)fVar138 * 0x800000 + (int)fVar118) *
                               (fVar141 + fVar118 +
                               (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452)
                                  * fVar141 + 0.041665796) * fVar141 + 0.16666666) * fVar141 + 0.5)
                               * fVar141 * fVar141) + fVar118;
                          auVar150._8_4_ =
                               (float)((int)fVar157 * 0x800000 + (int)fVar120) *
                               (fVar160 + fVar120 +
                               (((((fVar160 * 0.00019875691 + 0.0013981999) * fVar160 + 0.008333452)
                                  * fVar160 + 0.041665796) * fVar160 + 0.16666666) * fVar160 + 0.5)
                               * fVar160 * fVar160) + fVar120;
                          auVar150._12_4_ =
                               (float)((int)fVar161 * 0x800000 + (int)fVar142) *
                               (fVar140 + fVar142 +
                               (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452)
                                  * fVar140 + 0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5)
                               * fVar140 * fVar140) + fVar142;
                          auVar100 = divps(auVar97,auVar150);
                          break;
                        case 4:
                          auVar38._4_4_ = uVar188;
                          auVar38._0_4_ = uVar187;
                          auVar38._8_4_ = uVar189;
                          auVar38._12_4_ = uVar190;
                          auVar171 = minps(auVar100,auVar38);
                          auVar171 = maxps(auVar171,_DAT_005f0970);
                          fVar157 = auVar171._0_4_ * 1.442695 + 0.5;
                          fVar160 = auVar171._4_4_ * 1.442695 + 0.5;
                          fVar161 = auVar171._8_4_ * 1.442695 + 0.5;
                          fVar140 = auVar171._12_4_ * 1.442695 + 0.5;
                          fVar162 = (float)(int)fVar157;
                          fVar175 = (float)(int)fVar160;
                          fVar176 = (float)(int)fVar161;
                          fVar177 = (float)(int)fVar140;
                          fVar162 = fVar162 - (float)(-(uint)(fVar157 < fVar162) & (uint)fVar113);
                          fVar175 = fVar175 - (float)(-(uint)(fVar160 < fVar175) & (uint)fVar118);
                          fVar176 = fVar176 - (float)(-(uint)(fVar161 < fVar176) & (uint)fVar120);
                          fVar177 = fVar177 - (float)(-(uint)(fVar140 < fVar177) & (uint)fVar142);
                          fVar157 = auVar171._0_4_ - fVar162 * 0.6931472;
                          fVar160 = auVar171._4_4_ - fVar175 * 0.6931472;
                          fVar161 = auVar171._8_4_ - fVar176 * 0.6931472;
                          fVar140 = auVar171._12_4_ - fVar177 * 0.6931472;
                          auVar123._0_4_ =
                               (float)((int)fVar162 * 0x800000 + (int)fVar113) *
                               (fVar157 + fVar113 +
                               (((((fVar157 * 0.00019875691 + 0.0013981999) * fVar157 + 0.008333452)
                                  * fVar157 + 0.041665796) * fVar157 + 0.16666666) * fVar157 + 0.5)
                               * fVar157 * fVar157) + fVar113;
                          auVar123._4_4_ =
                               (float)((int)fVar175 * 0x800000 + (int)fVar118) *
                               (fVar160 + fVar118 +
                               (((((fVar160 * 0.00019875691 + 0.0013981999) * fVar160 + 0.008333452)
                                  * fVar160 + 0.041665796) * fVar160 + 0.16666666) * fVar160 + 0.5)
                               * fVar160 * fVar160) + fVar118;
                          auVar123._8_4_ =
                               (float)((int)fVar176 * 0x800000 + (int)fVar120) *
                               (fVar161 + fVar120 +
                               (((((fVar161 * 0.00019875691 + 0.0013981999) * fVar161 + 0.008333452)
                                  * fVar161 + 0.041665796) * fVar161 + 0.16666666) * fVar161 + 0.5)
                               * fVar161 * fVar161) + fVar120;
                          auVar123._12_4_ =
                               (float)((int)fVar177 * 0x800000 + (int)fVar142) *
                               (fVar140 + fVar142 +
                               (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452)
                                  * fVar140 + 0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5)
                               * fVar140 * fVar140) + fVar142;
                          auVar171 = maxps(auVar123,_DAT_005f0a10);
                          fVar157 = (float)(auVar171._0_4_ & 0x807fffff | 0x3f000000);
                          fVar161 = (float)(auVar171._4_4_ & 0x807fffff | 0x3f000000);
                          fVar162 = (float)(auVar171._8_4_ & 0x807fffff | 0x3f000000);
                          fVar176 = (float)(auVar171._12_4_ & 0x807fffff | 0x3f000000);
                          fVar160 = fVar157 + -1.0 +
                                    (float)(-(uint)(fVar157 < 0.70710677) & (uint)fVar157);
                          fVar140 = fVar161 + -1.0 +
                                    (float)(-(uint)(fVar161 < 0.70710677) & (uint)fVar161);
                          fVar175 = fVar162 + -1.0 +
                                    (float)(-(uint)(fVar162 < 0.70710677) & (uint)fVar162);
                          fVar177 = fVar176 + -1.0 +
                                    (float)(-(uint)(fVar176 < 0.70710677) & (uint)fVar176);
                          auVar124._0_4_ =
                               ~-(uint)(auVar123._0_4_ <= 0.0) &
                               (uint)((((float)(int)((auVar171._0_4_ >> 0x17) - 0x7e) -
                                       (float)(-(uint)(fVar157 < 0.70710677) & (uint)fVar113)) *
                                       0.6931472 + fVar160 +
                                      (((((((((fVar160 * 0.070376836 + -0.1151461) * fVar160 +
                                             0.116769984) * fVar160 + -0.12420141) * fVar160 +
                                           0.14249323) * fVar160 + -0.16668057) * fVar160 +
                                         0.20000714) * fVar160 + -0.24999994) * fVar160 + 0.3333333)
                                       * fVar160 + -0.5) * fVar160 * fVar160) * -2.0);
                          auVar124._4_4_ =
                               ~-(uint)(auVar123._4_4_ <= 0.0) &
                               (uint)((((float)(int)((auVar171._4_4_ >> 0x17) - 0x7e) -
                                       (float)(-(uint)(fVar161 < 0.70710677) & (uint)fVar118)) *
                                       0.6931472 + fVar140 +
                                      (((((((((fVar140 * 0.070376836 + -0.1151461) * fVar140 +
                                             0.116769984) * fVar140 + -0.12420141) * fVar140 +
                                           0.14249323) * fVar140 + -0.16668057) * fVar140 +
                                         0.20000714) * fVar140 + -0.24999994) * fVar140 + 0.3333333)
                                       * fVar140 + -0.5) * fVar140 * fVar140) * -2.0);
                          auVar124._8_4_ =
                               ~-(uint)(auVar123._8_4_ <= 0.0) &
                               (uint)((((float)(int)((auVar171._8_4_ >> 0x17) - 0x7e) -
                                       (float)(-(uint)(fVar162 < 0.70710677) & (uint)fVar120)) *
                                       0.6931472 + fVar175 +
                                      (((((((((fVar175 * 0.070376836 + -0.1151461) * fVar175 +
                                             0.116769984) * fVar175 + -0.12420141) * fVar175 +
                                           0.14249323) * fVar175 + -0.16668057) * fVar175 +
                                         0.20000714) * fVar175 + -0.24999994) * fVar175 + 0.3333333)
                                       * fVar175 + -0.5) * fVar175 * fVar175) * -2.0);
                          auVar124._12_4_ =
                               ~-(uint)(auVar123._12_4_ <= 0.0) &
                               (uint)((((float)(int)((auVar171._12_4_ >> 0x17) - 0x7e) -
                                       (float)(-(uint)(fVar176 < 0.70710677) & (uint)fVar142)) *
                                       0.6931472 + fVar177 +
                                      (((((((((fVar177 * 0.070376836 + -0.1151461) * fVar177 +
                                             0.116769984) * fVar177 + -0.12420141) * fVar177 +
                                           0.14249323) * fVar177 + -0.16668057) * fVar177 +
                                         0.20000714) * fVar177 + -0.24999994) * fVar177 + 0.3333333)
                                       * fVar177 + -0.5) * fVar177 * fVar177) * -2.0);
                          auVar174._0_8_ =
                               CONCAT44(-(uint)(auVar123._4_4_ <= 0.0),
                                        -(uint)(auVar123._0_4_ <= 0.0)) & 0x7fffffff7fffffff;
                          auVar174._8_4_ = -(uint)(auVar123._8_4_ <= 0.0) & 0x7fffffff;
                          auVar174._12_4_ = -(uint)(auVar123._12_4_ <= 0.0) & 0x7fffffff;
                          auVar171 = minps(auVar174 | auVar124,_DAT_005f0960);
                          auVar171 = maxps(auVar171,_DAT_005f0970);
                          fVar162 = auVar171._0_4_ * 1.442695 + 0.5;
                          fVar175 = auVar171._4_4_ * 1.442695 + 0.5;
                          fVar176 = auVar171._8_4_ * 1.442695 + 0.5;
                          fVar177 = auVar171._12_4_ * 1.442695 + 0.5;
                          fVar157 = (float)(int)fVar162;
                          fVar160 = (float)(int)fVar175;
                          fVar161 = (float)(int)fVar176;
                          fVar140 = (float)(int)fVar177;
                          fVar157 = fVar157 - (float)(-(uint)(fVar162 < fVar157) & (uint)fVar113);
                          fVar160 = fVar160 - (float)(-(uint)(fVar175 < fVar160) & (uint)fVar118);
                          fVar161 = fVar161 - (float)(-(uint)(fVar176 < fVar161) & (uint)fVar120);
                          fVar140 = fVar140 - (float)(-(uint)(fVar177 < fVar140) & (uint)fVar142);
                          fVar162 = auVar171._0_4_ - fVar157 * 0.6931472;
                          fVar175 = auVar171._4_4_ - fVar160 * 0.6931472;
                          fVar176 = auVar171._8_4_ - fVar161 * 0.6931472;
                          fVar177 = auVar171._12_4_ - fVar140 * 0.6931472;
                          auVar125._0_4_ =
                               (float)((int)fVar157 * 0x800000 + (int)fVar113) *
                               (fVar162 + fVar113 +
                               (((((fVar162 * 0.00019875691 + 0.0013981999) * fVar162 + 0.008333452)
                                  * fVar162 + 0.041665796) * fVar162 + 0.16666666) * fVar162 + 0.5)
                               * fVar162 * fVar162) + fVar113;
                          auVar125._4_4_ =
                               (float)((int)fVar160 * 0x800000 + (int)fVar118) *
                               (fVar175 + fVar118 +
                               (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452)
                                  * fVar175 + 0.041665796) * fVar175 + 0.16666666) * fVar175 + 0.5)
                               * fVar175 * fVar175) + fVar118;
                          auVar125._8_4_ =
                               (float)((int)fVar161 * 0x800000 + (int)fVar120) *
                               (fVar176 + fVar120 +
                               (((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452)
                                  * fVar176 + 0.041665796) * fVar176 + 0.16666666) * fVar176 + 0.5)
                               * fVar176 * fVar176) + fVar120;
                          auVar125._12_4_ =
                               (float)((int)fVar140 * 0x800000 + (int)fVar142) *
                               (fVar177 + fVar142 +
                               (((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452)
                                  * fVar177 + 0.041665796) * fVar177 + 0.16666666) * fVar177 + 0.5)
                               * fVar177 * fVar177) + fVar142;
                          auVar171 = divps(_DAT_005f1620,auVar125);
                          auVar100._0_4_ = fVar122 * (auVar171._0_4_ + -1.0);
                          auVar100._4_4_ = fVar136 * (auVar171._4_4_ + -1.0);
                          auVar100._8_4_ = fVar138 * (auVar171._8_4_ + -1.0);
                          auVar100._12_4_ = fVar141 * (auVar171._12_4_ + -1.0);
                          uVar187 = (int)DAT_005f0960;
                          uVar188 = DAT_005f0960._4_4_;
                          uVar189 = DAT_005f0960._8_4_;
                          uVar190 = DAT_005f0960._12_4_;
                          break;
                        case 5:
                          pfVar1 = (float *)(this->super_ConvolutionDepthWise).activation_params.
                                            data;
                          fVar157 = *pfVar1;
                          fVar160 = pfVar1[1];
                          auVar128._0_4_ = fVar157 * fVar122 + fVar160;
                          auVar128._4_4_ = fVar157 * fVar136 + fVar160;
                          auVar128._8_4_ = fVar157 * fVar138 + fVar160;
                          auVar128._12_4_ = fVar157 * fVar141 + fVar160;
                          auVar171 = maxps(auVar128,auVar96);
                          auVar171 = minps(auVar171,auVar97);
                          auVar100._0_4_ = fVar122 * auVar171._0_4_;
                          auVar100._4_4_ = fVar136 * auVar171._4_4_;
                          auVar100._8_4_ = fVar138 * auVar171._8_4_;
                          auVar100._12_4_ = fVar141 * auVar171._12_4_;
                        }
                        fVar122 = auVar182._0_4_;
                        fVar136 = auVar182._4_4_;
                        fVar138 = auVar182._8_4_;
                        fVar141 = auVar182._12_4_;
                        switch(iVar82) {
                        case 0:
                          auVar182 = maxps(auVar182,auVar96);
                          break;
                        case 1:
                          auVar171 = maxps(auVar182,auVar96);
                          auVar127 = minps(auVar182,auVar96);
                          fVar122 = *(this->super_ConvolutionDepthWise).activation_params.data;
                          auVar182._4_4_ = fVar122 * auVar127._4_4_ + auVar171._4_4_;
                          auVar182._0_4_ = fVar122 * auVar127._0_4_ + auVar171._0_4_;
                          auVar182._8_4_ = fVar122 * auVar127._8_4_ + auVar171._8_4_;
                          auVar182._12_4_ = fVar122 * auVar127._12_4_ + auVar171._12_4_;
                          break;
                        case 2:
                          puVar81 = (undefined4 *)
                                    (this->super_ConvolutionDepthWise).activation_params.data;
                          uVar5 = *puVar81;
                          uVar6 = puVar81[1];
                          auVar132._4_4_ = uVar5;
                          auVar132._0_4_ = uVar5;
                          auVar132._8_4_ = uVar5;
                          auVar132._12_4_ = uVar5;
                          auVar151._4_4_ = uVar6;
                          auVar151._0_4_ = uVar6;
                          auVar151._8_4_ = uVar6;
                          auVar151._12_4_ = uVar6;
                          auVar171 = maxps(auVar182,auVar132);
                          auVar182 = minps(auVar171,auVar151);
                          break;
                        case 3:
                          auVar181._0_8_ = auVar182._0_8_ ^ 0x8000000080000000;
                          auVar181._8_4_ = -fVar138;
                          auVar181._12_4_ = -fVar141;
                          auVar41._4_4_ = uVar188;
                          auVar41._0_4_ = uVar187;
                          auVar41._8_4_ = uVar189;
                          auVar41._12_4_ = uVar190;
                          auVar171 = minps(auVar181,auVar41);
                          auVar171 = maxps(auVar171,_DAT_005f0970);
                          fVar136 = auVar171._0_4_ * 1.442695 + 0.5;
                          fVar141 = auVar171._4_4_ * 1.442695 + 0.5;
                          fVar160 = auVar171._8_4_ * 1.442695 + 0.5;
                          fVar140 = auVar171._12_4_ * 1.442695 + 0.5;
                          fVar122 = (float)(int)fVar136;
                          fVar138 = (float)(int)fVar141;
                          fVar157 = (float)(int)fVar160;
                          fVar161 = (float)(int)fVar140;
                          fVar122 = fVar122 - (float)(-(uint)(fVar136 < fVar122) & (uint)fVar113);
                          fVar138 = fVar138 - (float)(-(uint)(fVar141 < fVar138) & (uint)fVar118);
                          fVar157 = fVar157 - (float)(-(uint)(fVar160 < fVar157) & (uint)fVar120);
                          fVar161 = fVar161 - (float)(-(uint)(fVar140 < fVar161) & (uint)fVar142);
                          fVar136 = fVar122 * -0.6931472 + auVar171._0_4_;
                          fVar141 = fVar138 * -0.6931472 + auVar171._4_4_;
                          fVar160 = fVar157 * -0.6931472 + auVar171._8_4_;
                          fVar140 = fVar161 * -0.6931472 + auVar171._12_4_;
                          auVar152._0_4_ =
                               (float)((int)fVar122 * 0x800000 + (int)fVar113) *
                               (fVar136 + fVar113 +
                               (((((fVar136 * 0.00019875691 + 0.0013981999) * fVar136 + 0.008333452)
                                  * fVar136 + 0.041665796) * fVar136 + 0.16666666) * fVar136 + 0.5)
                               * fVar136 * fVar136) + fVar113;
                          auVar152._4_4_ =
                               (float)((int)fVar138 * 0x800000 + (int)fVar118) *
                               (fVar141 + fVar118 +
                               (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452)
                                  * fVar141 + 0.041665796) * fVar141 + 0.16666666) * fVar141 + 0.5)
                               * fVar141 * fVar141) + fVar118;
                          auVar152._8_4_ =
                               (float)((int)fVar157 * 0x800000 + (int)fVar120) *
                               (fVar160 + fVar120 +
                               (((((fVar160 * 0.00019875691 + 0.0013981999) * fVar160 + 0.008333452)
                                  * fVar160 + 0.041665796) * fVar160 + 0.16666666) * fVar160 + 0.5)
                               * fVar160 * fVar160) + fVar120;
                          auVar152._12_4_ =
                               (float)((int)fVar161 * 0x800000 + (int)fVar142) *
                               (fVar140 + fVar142 +
                               (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452)
                                  * fVar140 + 0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5)
                               * fVar140 * fVar140) + fVar142;
                          auVar182 = divps(auVar97,auVar152);
                          break;
                        case 4:
                          auVar40._4_4_ = uVar188;
                          auVar40._0_4_ = uVar187;
                          auVar40._8_4_ = uVar189;
                          auVar40._12_4_ = uVar190;
                          auVar171 = minps(auVar182,auVar40);
                          auVar171 = maxps(auVar171,_DAT_005f0970);
                          fVar157 = auVar171._0_4_ * 1.442695 + 0.5;
                          fVar160 = auVar171._4_4_ * 1.442695 + 0.5;
                          fVar161 = auVar171._8_4_ * 1.442695 + 0.5;
                          fVar140 = auVar171._12_4_ * 1.442695 + 0.5;
                          fVar162 = (float)(int)fVar157;
                          fVar175 = (float)(int)fVar160;
                          fVar176 = (float)(int)fVar161;
                          fVar177 = (float)(int)fVar140;
                          fVar162 = fVar162 - (float)(-(uint)(fVar157 < fVar162) & (uint)fVar113);
                          fVar175 = fVar175 - (float)(-(uint)(fVar160 < fVar175) & (uint)fVar118);
                          fVar176 = fVar176 - (float)(-(uint)(fVar161 < fVar176) & (uint)fVar120);
                          fVar177 = fVar177 - (float)(-(uint)(fVar140 < fVar177) & (uint)fVar142);
                          fVar157 = auVar171._0_4_ - fVar162 * 0.6931472;
                          fVar160 = auVar171._4_4_ - fVar175 * 0.6931472;
                          fVar161 = auVar171._8_4_ - fVar176 * 0.6931472;
                          fVar140 = auVar171._12_4_ - fVar177 * 0.6931472;
                          auVar129._0_4_ =
                               (float)((int)fVar162 * 0x800000 + (int)fVar113) *
                               (fVar157 + fVar113 +
                               (((((fVar157 * 0.00019875691 + 0.0013981999) * fVar157 + 0.008333452)
                                  * fVar157 + 0.041665796) * fVar157 + 0.16666666) * fVar157 + 0.5)
                               * fVar157 * fVar157) + fVar113;
                          auVar129._4_4_ =
                               (float)((int)fVar175 * 0x800000 + (int)fVar118) *
                               (fVar160 + fVar118 +
                               (((((fVar160 * 0.00019875691 + 0.0013981999) * fVar160 + 0.008333452)
                                  * fVar160 + 0.041665796) * fVar160 + 0.16666666) * fVar160 + 0.5)
                               * fVar160 * fVar160) + fVar118;
                          auVar129._8_4_ =
                               (float)((int)fVar176 * 0x800000 + (int)fVar120) *
                               (fVar161 + fVar120 +
                               (((((fVar161 * 0.00019875691 + 0.0013981999) * fVar161 + 0.008333452)
                                  * fVar161 + 0.041665796) * fVar161 + 0.16666666) * fVar161 + 0.5)
                               * fVar161 * fVar161) + fVar120;
                          auVar129._12_4_ =
                               (float)((int)fVar177 * 0x800000 + (int)fVar142) *
                               (fVar140 + fVar142 +
                               (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452)
                                  * fVar140 + 0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5)
                               * fVar140 * fVar140) + fVar142;
                          auVar171 = maxps(auVar129,_DAT_005f0a10);
                          fVar157 = (float)(auVar171._0_4_ & 0x807fffff | 0x3f000000);
                          fVar161 = (float)(auVar171._4_4_ & 0x807fffff | 0x3f000000);
                          fVar162 = (float)(auVar171._8_4_ & 0x807fffff | 0x3f000000);
                          fVar176 = (float)(auVar171._12_4_ & 0x807fffff | 0x3f000000);
                          fVar160 = fVar157 + -1.0 +
                                    (float)(-(uint)(fVar157 < 0.70710677) & (uint)fVar157);
                          fVar140 = fVar161 + -1.0 +
                                    (float)(-(uint)(fVar161 < 0.70710677) & (uint)fVar161);
                          fVar175 = fVar162 + -1.0 +
                                    (float)(-(uint)(fVar162 < 0.70710677) & (uint)fVar162);
                          fVar177 = fVar176 + -1.0 +
                                    (float)(-(uint)(fVar176 < 0.70710677) & (uint)fVar176);
                          auVar130._0_4_ =
                               ~-(uint)(auVar129._0_4_ <= 0.0) &
                               (uint)((((float)(int)((auVar171._0_4_ >> 0x17) - 0x7e) -
                                       (float)(-(uint)(fVar157 < 0.70710677) & (uint)fVar113)) *
                                       0.6931472 + fVar160 +
                                      (((((((((fVar160 * 0.070376836 + -0.1151461) * fVar160 +
                                             0.116769984) * fVar160 + -0.12420141) * fVar160 +
                                           0.14249323) * fVar160 + -0.16668057) * fVar160 +
                                         0.20000714) * fVar160 + -0.24999994) * fVar160 + 0.3333333)
                                       * fVar160 + -0.5) * fVar160 * fVar160) * -2.0);
                          auVar130._4_4_ =
                               ~-(uint)(auVar129._4_4_ <= 0.0) &
                               (uint)((((float)(int)((auVar171._4_4_ >> 0x17) - 0x7e) -
                                       (float)(-(uint)(fVar161 < 0.70710677) & (uint)fVar118)) *
                                       0.6931472 + fVar140 +
                                      (((((((((fVar140 * 0.070376836 + -0.1151461) * fVar140 +
                                             0.116769984) * fVar140 + -0.12420141) * fVar140 +
                                           0.14249323) * fVar140 + -0.16668057) * fVar140 +
                                         0.20000714) * fVar140 + -0.24999994) * fVar140 + 0.3333333)
                                       * fVar140 + -0.5) * fVar140 * fVar140) * -2.0);
                          auVar130._8_4_ =
                               ~-(uint)(auVar129._8_4_ <= 0.0) &
                               (uint)((((float)(int)((auVar171._8_4_ >> 0x17) - 0x7e) -
                                       (float)(-(uint)(fVar162 < 0.70710677) & (uint)fVar120)) *
                                       0.6931472 + fVar175 +
                                      (((((((((fVar175 * 0.070376836 + -0.1151461) * fVar175 +
                                             0.116769984) * fVar175 + -0.12420141) * fVar175 +
                                           0.14249323) * fVar175 + -0.16668057) * fVar175 +
                                         0.20000714) * fVar175 + -0.24999994) * fVar175 + 0.3333333)
                                       * fVar175 + -0.5) * fVar175 * fVar175) * -2.0);
                          auVar130._12_4_ =
                               ~-(uint)(auVar129._12_4_ <= 0.0) &
                               (uint)((((float)(int)((auVar171._12_4_ >> 0x17) - 0x7e) -
                                       (float)(-(uint)(fVar176 < 0.70710677) & (uint)fVar142)) *
                                       0.6931472 + fVar177 +
                                      (((((((((fVar177 * 0.070376836 + -0.1151461) * fVar177 +
                                             0.116769984) * fVar177 + -0.12420141) * fVar177 +
                                           0.14249323) * fVar177 + -0.16668057) * fVar177 +
                                         0.20000714) * fVar177 + -0.24999994) * fVar177 + 0.3333333)
                                       * fVar177 + -0.5) * fVar177 * fVar177) * -2.0);
                          auVar186._0_8_ =
                               CONCAT44(-(uint)(auVar129._4_4_ <= 0.0),
                                        -(uint)(auVar129._0_4_ <= 0.0)) & 0x7fffffff7fffffff;
                          auVar186._8_4_ = -(uint)(auVar129._8_4_ <= 0.0) & 0x7fffffff;
                          auVar186._12_4_ = -(uint)(auVar129._12_4_ <= 0.0) & 0x7fffffff;
                          auVar171 = minps(auVar186 | auVar130,_DAT_005f0960);
                          auVar171 = maxps(auVar171,_DAT_005f0970);
                          fVar162 = auVar171._0_4_ * 1.442695 + 0.5;
                          fVar175 = auVar171._4_4_ * 1.442695 + 0.5;
                          fVar176 = auVar171._8_4_ * 1.442695 + 0.5;
                          fVar177 = auVar171._12_4_ * 1.442695 + 0.5;
                          fVar157 = (float)(int)fVar162;
                          fVar160 = (float)(int)fVar175;
                          fVar161 = (float)(int)fVar176;
                          fVar140 = (float)(int)fVar177;
                          fVar157 = fVar157 - (float)(-(uint)(fVar162 < fVar157) & (uint)fVar113);
                          fVar160 = fVar160 - (float)(-(uint)(fVar175 < fVar160) & (uint)fVar118);
                          fVar161 = fVar161 - (float)(-(uint)(fVar176 < fVar161) & (uint)fVar120);
                          fVar140 = fVar140 - (float)(-(uint)(fVar177 < fVar140) & (uint)fVar142);
                          fVar162 = auVar171._0_4_ - fVar157 * 0.6931472;
                          fVar175 = auVar171._4_4_ - fVar160 * 0.6931472;
                          fVar176 = auVar171._8_4_ - fVar161 * 0.6931472;
                          fVar177 = auVar171._12_4_ - fVar140 * 0.6931472;
                          auVar131._0_4_ =
                               (float)((int)fVar157 * 0x800000 + (int)fVar113) *
                               (fVar162 + fVar113 +
                               (((((fVar162 * 0.00019875691 + 0.0013981999) * fVar162 + 0.008333452)
                                  * fVar162 + 0.041665796) * fVar162 + 0.16666666) * fVar162 + 0.5)
                               * fVar162 * fVar162) + fVar113;
                          auVar131._4_4_ =
                               (float)((int)fVar160 * 0x800000 + (int)fVar118) *
                               (fVar175 + fVar118 +
                               (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452)
                                  * fVar175 + 0.041665796) * fVar175 + 0.16666666) * fVar175 + 0.5)
                               * fVar175 * fVar175) + fVar118;
                          auVar131._8_4_ =
                               (float)((int)fVar161 * 0x800000 + (int)fVar120) *
                               (fVar176 + fVar120 +
                               (((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452)
                                  * fVar176 + 0.041665796) * fVar176 + 0.16666666) * fVar176 + 0.5)
                               * fVar176 * fVar176) + fVar120;
                          auVar131._12_4_ =
                               (float)((int)fVar140 * 0x800000 + (int)fVar142) *
                               (fVar177 + fVar142 +
                               (((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452)
                                  * fVar177 + 0.041665796) * fVar177 + 0.16666666) * fVar177 + 0.5)
                               * fVar177 * fVar177) + fVar142;
                          auVar171 = divps(_DAT_005f1620,auVar131);
                          auVar182._0_4_ = fVar122 * (auVar171._0_4_ + -1.0);
                          auVar182._4_4_ = fVar136 * (auVar171._4_4_ + -1.0);
                          auVar182._8_4_ = fVar138 * (auVar171._8_4_ + -1.0);
                          auVar182._12_4_ = fVar141 * (auVar171._12_4_ + -1.0);
                          uVar187 = (int)DAT_005f0960;
                          uVar188 = DAT_005f0960._4_4_;
                          uVar189 = DAT_005f0960._8_4_;
                          uVar190 = DAT_005f0960._12_4_;
                          break;
                        case 5:
                          pfVar1 = (float *)(this->super_ConvolutionDepthWise).activation_params.
                                            data;
                          fVar142 = *pfVar1;
                          fVar157 = pfVar1[1];
                          auVar133._0_4_ = fVar142 * fVar122 + fVar157;
                          auVar133._4_4_ = fVar142 * fVar136 + fVar157;
                          auVar133._8_4_ = fVar142 * fVar138 + fVar157;
                          auVar133._12_4_ = fVar142 * fVar141 + fVar157;
                          auVar171 = maxps(auVar133,auVar96);
                          auVar171 = minps(auVar171,auVar97);
                          auVar182._0_4_ = fVar122 * auVar171._0_4_;
                          auVar182._4_4_ = fVar136 * auVar171._4_4_;
                          auVar182._8_4_ = fVar138 * auVar171._8_4_;
                          auVar182._12_4_ = fVar141 * auVar171._12_4_;
                        }
                        if (iVar32 < 0x65) {
                          *pauVar93 = auVar100;
                          pauVar93[1] = auVar182;
                          pauVar93 = pauVar93 + 2;
                        }
                        else {
                          pvVar35 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
                          pfVar1 = (float *)((long)pvVar35 + local_298 * 0x20);
                          pfVar2 = (float *)((long)pvVar35 + local_298 * 0x20 + 0x10);
                          fVar122 = *pfVar1 * auVar100._0_4_;
                          fVar136 = pfVar1[1] * auVar100._4_4_;
                          fVar138 = pfVar1[2] * auVar100._8_4_;
                          fVar141 = pfVar1[3] * auVar100._12_4_;
                          fVar142 = *pfVar2 * auVar182._0_4_;
                          fVar157 = pfVar2[1] * auVar182._4_4_;
                          fVar160 = pfVar2[2] * auVar182._8_4_;
                          fVar161 = pfVar2[3] * auVar182._12_4_;
                          auVar101._0_4_ =
                               (int)((float)((uint)fVar122 & 0x80000000 | 0x3f000000) + fVar122);
                          auVar101._4_4_ =
                               (int)((float)((uint)fVar136 & 0x80000000 | 0x3f000000) + fVar136);
                          auVar101._8_4_ =
                               (int)((float)((uint)fVar138 & 0x80000000 | 0x3f000000) + fVar138);
                          auVar101._12_4_ =
                               (int)((float)((uint)fVar141 & 0x80000000 | 0x3f000000) + fVar141);
                          auVar134._0_4_ =
                               (int)((float)((uint)fVar142 & 0x80000000 | 0x3f000000) + fVar142);
                          auVar134._4_4_ =
                               (int)((float)((uint)fVar157 & 0x80000000 | 0x3f000000) + fVar157);
                          auVar134._8_4_ =
                               (int)((float)((uint)fVar160 & 0x80000000 | 0x3f000000) + fVar160);
                          auVar134._12_4_ =
                               (int)((float)((uint)fVar161 & 0x80000000 | 0x3f000000) + fVar161);
                          auVar171 = packssdw(auVar101,auVar134);
                          sVar183 = auVar171._0_2_;
                          uVar98 = (ushort)(0x7f < sVar183) * 0x7f |
                                   (ushort)(0x7f >= sVar183) * sVar183;
                          sVar183 = auVar171._2_2_;
                          uVar103 = (ushort)(0x7f < sVar183) * 0x7f |
                                    (ushort)(0x7f >= sVar183) * sVar183;
                          sVar183 = auVar171._4_2_;
                          uVar104 = (ushort)(0x7f < sVar183) * 0x7f |
                                    (ushort)(0x7f >= sVar183) * sVar183;
                          sVar183 = auVar171._6_2_;
                          uVar105 = (ushort)(0x7f < sVar183) * 0x7f |
                                    (ushort)(0x7f >= sVar183) * sVar183;
                          sVar183 = auVar171._8_2_;
                          uVar106 = (ushort)(0x7f < sVar183) * 0x7f |
                                    (ushort)(0x7f >= sVar183) * sVar183;
                          sVar183 = auVar171._10_2_;
                          uVar108 = (ushort)(0x7f < sVar183) * 0x7f |
                                    (ushort)(0x7f >= sVar183) * sVar183;
                          sVar183 = auVar171._12_2_;
                          sVar112 = auVar171._14_2_;
                          uVar109 = (ushort)(0x7f < sVar183) * 0x7f |
                                    (ushort)(0x7f >= sVar183) * sVar183;
                          uVar111 = (ushort)(0x7f < sVar112) * 0x7f |
                                    (ushort)(0x7f >= sVar112) * sVar112;
                          auVar102._0_2_ =
                               (ushort)((short)uVar98 < -0x7f) * -0x7f |
                               ((short)uVar98 >= -0x7f) * uVar98;
                          auVar102._2_2_ =
                               (ushort)((short)uVar103 < -0x7f) * -0x7f |
                               ((short)uVar103 >= -0x7f) * uVar103;
                          auVar102._4_2_ =
                               (ushort)((short)uVar104 < -0x7f) * -0x7f |
                               ((short)uVar104 >= -0x7f) * uVar104;
                          auVar102._6_2_ =
                               (ushort)((short)uVar105 < -0x7f) * -0x7f |
                               ((short)uVar105 >= -0x7f) * uVar105;
                          auVar102._8_2_ =
                               (ushort)((short)uVar106 < -0x7f) * -0x7f |
                               ((short)uVar106 >= -0x7f) * uVar106;
                          auVar102._10_2_ =
                               (ushort)((short)uVar108 < -0x7f) * -0x7f |
                               ((short)uVar108 >= -0x7f) * uVar108;
                          auVar102._12_2_ =
                               (ushort)((short)uVar109 < -0x7f) * -0x7f |
                               ((short)uVar109 >= -0x7f) * uVar109;
                          auVar102._14_2_ =
                               (ushort)((short)uVar111 < -0x7f) * -0x7f |
                               ((short)uVar111 >= -0x7f) * uVar111;
                          auVar171 = packsswb(auVar102,auVar102);
                          *(long *)*pauVar94 = auVar171._0_8_;
                          pauVar94 = (undefined1 (*) [16])((long)*pauVar94 + 8);
                        }
                        bVar95 = iVar80 != iVar85;
                        iVar80 = iVar80 + 1;
                      } while (bVar95);
                    }
                    bVar95 = iVar90 != (uint)local_2a8;
                    iVar90 = iVar90 + 1;
                  } while (bVar95);
                }
                uVar91 = local_298 + 1;
                local_290 = (void *)(ulong)(uint)((int)local_290 + iVar86);
                local_298 = uVar91;
              } while (uVar91 != local_240);
            }
            iVar86 = (int)uVar91;
            if (local_2f8.data != (void *)0x0) {
              uVar91 = local_2f8.elemsize - (long)local_2f8.data;
              operator_delete(local_2f8.data,uVar91);
              iVar86 = (int)uVar91;
            }
            local_300 = 0;
            local_2f8.refcount = (int *)CONCAT44(local_2f8.refcount._4_4_,local_2f8.refcount._0_4_);
            if (local_188._0_4_ == 1) goto LAB_0040b949;
          }
        }
      }
    }
    else {
      iVar85 = (this->super_ConvolutionDepthWise).int8_scale_term;
      local_2a8 = 1;
      if (opt->use_packing_layout == true) {
        uVar88 = (this->super_ConvolutionDepthWise).num_output;
        if (iVar85 < 0x65) {
          local_2a8 = (ulong)((uint)((uVar88 & 3) == 0) * 3 + 1);
        }
        else {
          local_2a8 = 1;
          if ((uVar88 & 7) == 0) {
            local_2a8 = 8;
          }
        }
      }
      iVar32 = (int)local_2a8;
      uVar91 = (ulong)(uint)(iVar32 * 4);
      if (100 < iVar85) {
        uVar91 = local_2a8;
      }
      Mat::create(top_blob,iVar86,iVar90,(this->super_ConvolutionDepthWise).num_output / iVar32,
                  uVar91,iVar32,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        local_300 = -100;
      }
      else {
        local_300 = -100;
        local_2f8.refcount = (int *)CONCAT44(local_2f8.refcount._4_4_,local_2f8.refcount._0_4_);
        if ((long)top_blob->c * top_blob->cstep != 0) {
          iVar32 = (this->super_ConvolutionDepthWise).group;
          uVar84 = (int)uVar84 / iVar32;
          local_2a0 = (float *)CONCAT44(local_2a0._4_4_,uVar84);
          uVar88 = (this->super_ConvolutionDepthWise).num_output / iVar32;
          local_2b0 = (float *)CONCAT44(local_2b0._4_4_,uVar88);
          local_31c = 1;
          uVar92 = 1;
          if (opt->use_packing_layout == true) {
            local_31c = 1;
            if ((uVar84 & 7) == 0) {
              local_31c = 8;
            }
            if (iVar85 < 0x65) {
              uVar92 = (uint)((uVar88 & 3) == 0) * 3 + 1;
            }
            else {
              uVar92 = 1;
              if ((uVar88 & 7) == 0) {
                uVar92 = 8;
              }
            }
          }
          piVar33 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
          local_2f8.data = local_288.data;
          local_2f8.refcount._0_4_ = local_288.refcount._0_4_;
          local_2f8.refcount._4_4_ = local_288.refcount._4_4_;
          local_2f8.elemsize = CONCAT44(local_288.elemsize._4_4_,(undefined4)local_288.elemsize);
          local_2f8.elempack = local_288.elempack;
          local_2f8.allocator = local_288.allocator;
          local_2f8.dims = local_288.dims;
          local_2f8.w = local_288.w;
          local_2f8.h = local_288.h;
          local_2f8.d = local_288.d;
          local_2f8.c = local_288.c;
          local_2f8.cstep = local_288.cstep;
          if (piVar33 != (int *)0x0) {
            LOCK();
            *piVar33 = *piVar33 + 1;
            UNLOCK();
          }
          if (local_31c < (int)local_188._0_4_) {
            uVar59._0_1_ = opt->lightmode;
            uVar59._1_1_ = opt->use_shader_pack8;
            uVar59._2_1_ = opt->use_subgroup_ops;
            uVar59._3_1_ = opt->use_reserved_0;
            uVar59._4_4_ = opt->num_threads;
            local_238._16_8_ = opt->workspace_allocator;
            uVar60 = opt->openmp_blocktime;
            uVar61 = opt->use_winograd_convolution;
            uVar63 = opt->use_sgemm_convolution;
            uVar65 = opt->use_int8_inference;
            uVar67 = opt->use_vulkan_compute;
            uVar66 = CONCAT11(uVar67,uVar65);
            uVar64 = CONCAT21(uVar66,uVar63);
            uVar62 = CONCAT31(uVar64,uVar61);
            local_238._32_8_ = *(undefined8 *)&opt->use_bf16_storage;
            auStack_210._0_4_ = opt->vulkan_device_index;
            auStack_210[4] = opt->use_reserved_1;
            auStack_210[5] = opt->use_image_storage;
            auStack_210[6] = opt->use_tensor_storage;
            auStack_210[7] = opt->use_reserved_2;
            auStack_210._8_4_ = opt->flush_denormals;
            auStack_210[0xc] = opt->use_local_pool_allocator;
            auStack_210[0xd] = opt->use_shader_local_memory;
            auStack_210[0xe] = opt->use_cooperative_matrix;
            auStack_210[0xf] = opt->use_winograd23_convolution;
            uStack_200._0_1_ = opt->use_winograd43_convolution;
            uStack_200._1_1_ = opt->use_winograd63_convolution;
            uStack_200._2_1_ = opt->use_a53_a55_optimized_kernel;
            uStack_200._3_1_ = opt->use_fp16_uniform;
            uStack_200._4_1_ = opt->use_int8_uniform;
            uStack_200._5_1_ = opt->use_reserved_9;
            uStack_200._6_1_ = opt->use_reserved_10;
            uStack_200._7_1_ = opt->use_reserved_11;
            local_238._0_4_ = (undefined4)uVar59;
            local_238._8_4_ = SUB84(opt->workspace_allocator,0);
            local_238._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
            local_238._4_4_ = uVar59._4_4_;
            local_238._24_4_ = uVar60;
            local_238._28_4_ = uVar62;
            convert_packing(&local_288,&local_2f8,local_31c,(Option *)local_238);
            if ((local_2f8.data != (void *)0x0) && ((long)local_2f8.c * local_2f8.cstep != 0))
            goto LAB_0040bd3a;
            local_300 = -100;
          }
          else {
LAB_0040bd3a:
            local_238._0_4_ = SUB84(top_blob->data,0);
            local_238._4_4_ = (undefined4)((ulong)top_blob->data >> 0x20);
            piVar33 = top_blob->refcount;
            local_238._8_4_ = SUB84(piVar33,0);
            local_238._12_4_ = (undefined4)((ulong)piVar33 >> 0x20);
            local_238._16_8_ = top_blob->elemsize;
            local_238._24_4_ = top_blob->elempack;
            local_238._32_8_ = top_blob->allocator;
            auStack_210._0_4_ = top_blob->dims;
            auStack_210._4_4_ = top_blob->w;
            auStack_210._8_4_ = top_blob->h;
            auStack_210._12_4_ = top_blob->d;
            uStack_200 = CONCAT44(uStack_200._4_4_,top_blob->c);
            local_1f8 = top_blob->cstep;
            if (piVar33 != (int *)0x0) {
              LOCK();
              *piVar33 = *piVar33 + 1;
              UNLOCK();
            }
            if (uVar92 < (uint)local_2a8) {
              Mat::create((Mat *)local_238,iVar86,iVar90,
                          (this->super_ConvolutionDepthWise).num_output / (int)uVar92,
                          (ulong)((int)(uVar91 / (local_2a8 & 0xffffffff)) * uVar92),uVar92,
                          opt->workspace_allocator);
              local_300 = -100;
              if ((CONCAT44(local_238._4_4_,local_238._0_4_) != 0) &&
                 ((long)(int)uStack_200 * local_1f8 != 0)) goto LAB_0040be1f;
            }
            else {
LAB_0040be1f:
              iVar85 = (this->super_ConvolutionDepthWise).group;
              bVar95 = 0 < iVar85;
              if (iVar85 < 1) {
                local_300 = -100;
              }
              else {
                local_290 = (void *)CONCAT44(local_290._4_4_,(int)local_2a0 / local_31c);
                local_298 = CONCAT44(local_298._4_4_,(int)local_2b0 / (int)uVar92);
                local_300 = -100;
                iVar85 = 0;
                iVar86 = 0;
                lVar78 = 0;
                do {
                  local_1d8 = (void *)((long)(iVar85 / local_31c) * local_2f8.cstep *
                                       local_2f8.elemsize + (long)local_2f8.data);
                  uStack_1d0 = 0;
                  uStack_1cc = 0;
                  local_1c8 = local_2f8.elemsize;
                  local_1c0 = local_2f8.elempack;
                  local_1b8 = local_2f8.allocator;
                  auVar75._4_8_ = local_1b0._8_8_;
                  auVar75._0_4_ = local_2f8.w;
                  local_1b0._0_8_ = auVar75._0_8_ << 0x20;
                  local_1b0._8_4_ = local_2f8.h;
                  local_1b0._12_4_ = local_2f8.d;
                  local_1a0 = (int)local_290;
                  local_198 = ((long)local_2f8.d * local_2f8.elemsize *
                               (long)local_2f8.h * (long)local_2f8.w + 0xf & 0xfffffffffffffff0) /
                              local_2f8.elemsize;
                  local_1b0._0_4_ = local_2f8.dims;
                  local_178 = (void *)((long)(iVar86 / (int)uVar92) * local_1f8 * local_238._16_8_ +
                                      CONCAT44(local_238._4_4_,local_238._0_4_));
                  uStack_170 = 0;
                  uStack_16c = 0;
                  local_168 = (Allocator *)local_238._16_8_;
                  local_160 = local_238._24_4_;
                  local_158 = (Allocator *)local_238._32_8_;
                  auVar76._4_8_ = local_150._8_8_;
                  auVar76._0_4_ = auStack_210._4_4_;
                  local_150._0_8_ = auVar76._0_8_ << 0x20;
                  local_150._8_4_ = auStack_210._8_4_;
                  local_150._12_4_ = auStack_210._12_4_;
                  local_140 = (undefined4)local_298;
                  local_138 = ((long)(int)auStack_210._12_4_ * local_238._16_8_ *
                               (long)(int)auStack_210._8_4_ * (long)(int)auStack_210._4_4_ + 0xfU &
                              0xfffffffffffffff0) / (ulong)local_238._16_8_;
                  local_150._0_4_ = auStack_210._0_4_;
                  pLVar37 = (this->group_ops).
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar78];
                  local_78._0_1_ = opt->lightmode;
                  local_78._1_1_ = opt->use_shader_pack8;
                  local_78._2_1_ = opt->use_subgroup_ops;
                  local_78._3_1_ = opt->use_reserved_0;
                  local_78._4_4_ = opt->num_threads;
                  local_68 = opt->workspace_allocator;
                  uStack_60._0_4_ = opt->openmp_blocktime;
                  uStack_60._4_1_ = opt->use_winograd_convolution;
                  uStack_60._5_1_ = opt->use_sgemm_convolution;
                  uStack_60._6_1_ = opt->use_int8_inference;
                  uStack_60._7_1_ = opt->use_vulkan_compute;
                  local_58._0_1_ = opt->use_bf16_storage;
                  local_58._1_1_ = opt->use_fp16_packed;
                  local_58._2_1_ = opt->use_fp16_storage;
                  local_58._3_1_ = opt->use_fp16_arithmetic;
                  uStack_54._0_1_ = opt->use_int8_packed;
                  uStack_54._1_1_ = opt->use_int8_storage;
                  uStack_54._2_1_ = opt->use_int8_arithmetic;
                  uStack_54._3_1_ = opt->use_packing_layout;
                  iStack_50 = opt->vulkan_device_index;
                  uStack_4c._0_1_ = opt->use_reserved_1;
                  uStack_4c._1_1_ = opt->use_image_storage;
                  uStack_4c._2_1_ = opt->use_tensor_storage;
                  uStack_4c._3_1_ = opt->use_reserved_2;
                  local_48._0_4_ = opt->flush_denormals;
                  local_48._4_1_ = opt->use_local_pool_allocator;
                  local_48._5_1_ = opt->use_shader_local_memory;
                  local_48._6_1_ = opt->use_cooperative_matrix;
                  local_48._7_1_ = opt->use_winograd23_convolution;
                  uStack_40._0_1_ = opt->use_winograd43_convolution;
                  uStack_40._1_1_ = opt->use_winograd63_convolution;
                  uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
                  uStack_40._3_1_ = opt->use_fp16_uniform;
                  uStack_40._4_1_ = opt->use_int8_uniform;
                  uStack_40._5_1_ = opt->use_reserved_9;
                  uStack_40._6_1_ = opt->use_reserved_10;
                  uStack_40._7_1_ = opt->use_reserved_11;
                  pAStack_70 = (Allocator *)local_238._32_8_;
                  iVar90 = (*pLVar37->_vptr_Layer[7])(pLVar37,&local_1d8,&local_178,&local_78);
                  if (iVar90 != 0) {
                    local_300 = iVar90;
                  }
                  piVar33 = (int *)CONCAT44(uStack_16c,uStack_170);
                  if (piVar33 != (int *)0x0) {
                    LOCK();
                    *piVar33 = *piVar33 + -1;
                    UNLOCK();
                    if (*piVar33 == 0) {
                      if (local_158 == (Allocator *)0x0) {
                        if (local_178 != (void *)0x0) {
                          free(local_178);
                        }
                      }
                      else {
                        (*local_158->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_138 = 0;
                  local_178 = (void *)0x0;
                  uStack_170 = 0;
                  uStack_16c = 0;
                  local_168 = (Allocator *)0x0;
                  local_160 = 0;
                  local_150 = (undefined1  [16])0x0;
                  local_140 = 0;
                  piVar33 = (int *)CONCAT44(uStack_1cc,uStack_1d0);
                  if (piVar33 != (int *)0x0) {
                    LOCK();
                    *piVar33 = *piVar33 + -1;
                    UNLOCK();
                    if (*piVar33 == 0) {
                      if (local_1b8 == (Allocator *)0x0) {
                        if (local_1d8 != (void *)0x0) {
                          free(local_1d8);
                        }
                      }
                      else {
                        (*local_1b8->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_198 = 0;
                  local_1d8._0_4_ = 0.0;
                  local_1d8._4_4_ = 0;
                  uStack_1d0 = 0;
                  uStack_1cc = 0;
                  local_1c8 = 0;
                  local_1c0 = 0;
                  local_1b0 = (undefined1  [16])0x0;
                  local_1a0 = 0;
                  if (iVar90 != 0) break;
                  lVar78 = lVar78 + 1;
                  lVar87 = (long)(this->super_ConvolutionDepthWise).group;
                  iVar86 = iVar86 + (int)local_2b0;
                  iVar85 = iVar85 + (int)local_2a0;
                  bVar95 = lVar78 < lVar87;
                } while (lVar78 < lVar87);
              }
              if (!bVar95) {
                if (uVar92 < (uint)local_2a8) {
                  convert_packing((Mat *)local_238,top_blob,(uint)local_2a8,opt);
                  local_300 = -100;
                  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
                  goto LAB_0040cac8;
                }
                else if ((Mat *)local_238 != top_blob) {
                  piVar33 = (int *)CONCAT44(local_238._12_4_,local_238._8_4_);
                  if (piVar33 != (int *)0x0) {
                    LOCK();
                    *piVar33 = *piVar33 + 1;
                    UNLOCK();
                  }
                  piVar33 = top_blob->refcount;
                  if (piVar33 != (int *)0x0) {
                    LOCK();
                    *piVar33 = *piVar33 + -1;
                    UNLOCK();
                    if (*piVar33 == 0) {
                      if (top_blob->allocator == (Allocator *)0x0) {
                        if (top_blob->data != (void *)0x0) {
                          free(top_blob->data);
                        }
                      }
                      else {
                        (*top_blob->allocator->_vptr_Allocator[3])();
                      }
                    }
                  }
                  auVar97 = auStack_210;
                  top_blob->cstep = 0;
                  top_blob->data = (void *)0x0;
                  top_blob->refcount = (int *)0x0;
                  *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
                  top_blob->dims = 0;
                  top_blob->w = 0;
                  top_blob->h = 0;
                  top_blob->d = 0;
                  top_blob->c = 0;
                  top_blob->data = (void *)CONCAT44(local_238._4_4_,local_238._0_4_);
                  top_blob->refcount = (int *)CONCAT44(local_238._12_4_,local_238._8_4_);
                  top_blob->elemsize = local_238._16_8_;
                  top_blob->elempack = local_238._24_4_;
                  top_blob->allocator = (Allocator *)local_238._32_8_;
                  top_blob->dims = auStack_210._0_4_;
                  top_blob->w = auStack_210._4_4_;
                  top_blob->h = auStack_210._8_4_;
                  top_blob->d = auStack_210._12_4_;
                  top_blob->c = (int)uStack_200;
                  top_blob->cstep = local_1f8;
                  auStack_210 = auVar97;
                }
                local_300 = 0;
              }
            }
LAB_0040cac8:
            piVar33 = (int *)CONCAT44(local_238._12_4_,local_238._8_4_);
            if (piVar33 != (int *)0x0) {
              LOCK();
              *piVar33 = *piVar33 + -1;
              UNLOCK();
              if (*piVar33 == 0) {
                if ((Allocator *)local_238._32_8_ == (Allocator *)0x0) {
                  if ((void *)CONCAT44(local_238._4_4_,local_238._0_4_) != (void *)0x0) {
                    free((void *)CONCAT44(local_238._4_4_,local_238._0_4_));
                  }
                }
                else {
                  (*(*(_func_int ***)local_238._32_8_)[3])();
                }
              }
            }
            local_1f8 = 0;
            local_238._0_4_ = 0.0;
            local_238._4_4_ = 0;
            local_238._8_4_ = 0;
            local_238._12_4_ = 0;
            local_238._16_8_ = (Allocator *)0x0;
            local_238._24_4_ = 0;
            auStack_210 = (undefined1  [16])0x0;
            uStack_200 = uStack_200 & 0xffffffff00000000;
          }
          piVar33 = (int *)CONCAT44(local_2f8.refcount._4_4_,local_2f8.refcount._0_4_);
          if (piVar33 != (int *)0x0) {
            LOCK();
            *piVar33 = *piVar33 + -1;
            UNLOCK();
            if (*piVar33 == 0) {
              if (local_2f8.allocator == (Allocator *)0x0) {
                if (local_2f8.data != (void *)0x0) {
                  free(local_2f8.data);
                }
              }
              else {
                (*(local_2f8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_2f8.cstep = 0;
          local_2f8.data = (void *)0x0;
          local_2f8.refcount = (int *)0x0;
          local_2f8.elemsize = 0;
          local_2f8.elempack = 0;
          local_2f8.dims = 0;
          local_2f8.w = 0;
          local_2f8.h = 0;
          local_2f8.d = 0;
          local_2f8.c = 0;
        }
      }
    }
  }
  piVar33 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
  if (piVar33 != (int *)0x0) {
    LOCK();
    *piVar33 = *piVar33 + -1;
    UNLOCK();
    if (*piVar33 == 0) {
      if (local_288.allocator == (Allocator *)0x0) {
        if (local_288.data != (void *)0x0) {
          free(local_288.data);
        }
      }
      else {
        (*(local_288.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_0040cbf8:
  local_288.cstep = 0;
  local_288.c = 0;
  local_288.d = 0;
  local_288.h = 0;
  local_288.w = 0;
  local_288.dims = 0;
  local_288.elempack = 0;
  local_288.elemsize._4_4_ = 0;
  local_288.elemsize._0_4_ = 0;
  local_288.refcount._4_4_ = 0;
  local_288.refcount._0_4_ = 0;
  local_288.data = (void *)0x0;
  piVar33 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
  if (piVar33 != (int *)0x0) {
    LOCK();
    *piVar33 = *piVar33 + -1;
    UNLOCK();
    if (*piVar33 == 0) {
      if (local_128.allocator == (Allocator *)0x0) {
        if (local_128.data != (void *)0x0) {
          free(local_128.data);
        }
      }
      else {
        (*(local_128.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return local_300;
}

Assistant:

int ConvolutionDepthWise_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
        if (bottom_blob_int8.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        if (use_int8_requantize)
            out_g_elempack = num_output_g % 8 == 0 ? 8 : 1;
        else
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
        if (bottom_blob_bordered_unpacked.empty())
            return -100;
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        int ret = op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        if (ret != 0)
            return ret;
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}